

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorRK64.cpp
# Opt level: O3

int __thiscall
pele::physics::reactions::ReactorRK64::react
          (ReactorRK64 *this,Real *rY_in,Real *rYsrc_in,Real *rX_in,Real *rX_src_in,Real *dt_react,
          Real *time,int ncells)

{
  undefined4 uVar1;
  Real RVar2;
  undefined4 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  uint uVar20;
  Real *pRVar21;
  Real *__dest;
  value_type_conflict2 vVar22;
  int i;
  int iVar23;
  long lVar24;
  pointer pdVar25;
  ulong uVar26;
  double *pdVar27;
  allocator_type *paVar28;
  double *pdVar29;
  undefined8 *puVar30;
  pointer pdVar31;
  ulong uVar32;
  ulong uVar33;
  size_type sVar34;
  size_type a_size;
  long lVar35;
  byte bVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dd;
  uint uVar39;
  uint uVar40;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  Real T_1;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  Real T;
  double dVar57;
  double dVar58;
  Real hml [9];
  Real tmp [9];
  GpuArray<double,_9U> ei_pt;
  DeviceVector<amrex::Real> rYsrc;
  DeviceVector<amrex::Real> rY;
  DeviceVector<int> v_nsteps;
  DeviceVector<amrex::Real> rX_src;
  DeviceVector<amrex::Real> rX;
  Real rhs [10];
  double local_950;
  undefined4 local_918;
  undefined4 uStack_914;
  undefined4 local_908;
  undefined4 uStack_904;
  double dStack_8e0;
  undefined1 local_8d8 [16];
  double local_8c8;
  double dStack_8c0;
  undefined1 local_8b8 [8];
  undefined8 uStack_8b0;
  double local_8a8;
  double dStack_8a0;
  undefined1 *local_898;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  double local_860;
  undefined1 local_858 [16];
  double local_848;
  undefined1 auStack_840 [16];
  double dStack_830;
  double local_828;
  double dStack_820;
  undefined1 *local_818;
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  double local_7d0;
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [16];
  undefined1 local_7a8 [16];
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  undefined1 local_748 [24];
  size_type local_730;
  Real *local_728;
  Real *local_720;
  Real *local_718;
  pointer local_710;
  pointer local_708;
  pointer local_700;
  double local_6f8;
  int local_6ec;
  undefined1 local_6e8 [12];
  undefined4 uStack_6dc;
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  pointer local_690;
  size_type local_688;
  Real *local_680;
  double local_678;
  double local_670;
  double local_668;
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  double local_630;
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [16];
  double local_5c8;
  double dStack_5c0;
  undefined1 local_5b8 [16];
  double local_5a8;
  double dStack_5a0;
  double local_598;
  double local_590 [9];
  double local_548;
  double dStack_540;
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  double local_438;
  undefined8 uStack_430;
  undefined1 local_428 [16];
  double local_418;
  undefined8 uStack_410;
  pointer local_408;
  size_type local_400;
  ulong local_3f8;
  ulong local_3f0;
  double local_3e8;
  double local_3e0;
  long local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  undefined1 local_3b8 [16];
  PODVector<double,_std::allocator<double>_> local_3a0;
  PODVector<double,_std::allocator<double>_> local_388;
  undefined4 uStack_36c;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined4 local_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  double local_338;
  double dStack_330;
  PODVector<int,_std::allocator<int>_> local_320;
  PODVector<double,_std::allocator<double>_> local_308;
  PODVector<double,_std::allocator<double>_> local_2f0;
  allocator_type local_2d8 [72];
  double local_290;
  value_type_conflict2 local_280;
  pointer local_278;
  Real local_270;
  int local_268;
  undefined8 local_264;
  pointer local_258;
  pointer local_250;
  pointer local_248;
  double local_240;
  uint local_238;
  undefined1 local_234 [8];
  undefined8 uStack_22c;
  undefined8 local_224;
  undefined8 uStack_21c;
  undefined8 local_214;
  undefined8 uStack_20c;
  undefined4 local_204;
  double local_200 [15];
  int local_188;
  undefined8 local_180;
  Real local_178;
  pointer local_170;
  double local_168 [10];
  double local_118 [10];
  double local_c8 [19];
  
  bVar36 = 0;
  a_size = (size_type)ncells;
  dVar57 = *time;
  dVar46 = *dt_react;
  local_730 = (size_type)(ncells * 10);
  local_280 = 0.0;
  local_728 = rY_in;
  local_720 = rYsrc_in;
  local_718 = rX_in;
  local_680 = rX_src_in;
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (&local_388,local_730,&local_280,local_2d8);
  sVar34 = (size_type)(ncells * 9);
  local_280 = 0.0;
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (&local_3a0,sVar34,&local_280,local_2d8);
  local_280 = 0.0;
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (&local_2f0,a_size,&local_280,local_2d8);
  local_280 = 0.0;
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (&local_308,a_size,&local_280,local_2d8);
  pdVar25 = local_308.m_data;
  pRVar21 = local_680;
  local_710 = local_388.m_data;
  local_708 = local_3a0.m_data;
  local_700 = local_2f0.m_data;
  if (a_size != 0) {
    memcpy(local_388.m_data,local_728,local_730 * 8);
    memcpy(local_708,local_720,sVar34 * 8);
    memcpy(local_700,local_718,a_size * 8);
    memcpy(pdVar25,pRVar21,a_size * 8);
  }
  iVar23 = this->m_reactor_type;
  iVar4 = this->rk64_nsubsteps_guess;
  RVar2 = this->absTol;
  local_348 = 0x20c4d527;
  uStack_344 = 0x3ff3ec38;
  uStack_340 = 0x8268816c;
  uStack_33c = 0x3fda6434;
  local_358 = 0x668fef0a;
  uStack_354 = 0x3fe0e07b;
  uStack_350 = 0x8225473a;
  uStack_34c = 0x3fa8d336;
  local_368 = 0x970776b5;
  uStack_364 = 0x3fcbec5d;
  uStack_360 = 0x3226659c;
  uStack_35c = 0x3fd06dd0;
  local_280 = (value_type_conflict2)((ulong)local_280 & 0xffffffff00000000);
  uVar1 = this->rk64_nsubsteps_min;
  uVar3 = this->rk64_nsubsteps_max;
  local_688 = sVar34;
  amrex::PODVector<int,_std::allocator<int>_>::PODVector
            (&local_320,a_size,(value_type_conflict *)&local_280,(allocator_type *)local_2d8);
  local_280 = dVar57;
  local_278 = local_710;
  local_270 = *dt_react;
  local_268 = iVar4;
  local_264 = CONCAT44(uVar1,uVar3);
  local_258 = local_700;
  local_690 = pdVar25;
  local_250 = pdVar25;
  local_248 = local_708;
  local_240 = dVar46 + dVar57;
  local_238 = 6;
  local_234 = (undefined1  [8])CONCAT44(local_368,uStack_36c);
  uStack_22c = CONCAT44(uStack_360,uStack_364);
  local_224 = CONCAT44(local_358,uStack_35c);
  uStack_21c = CONCAT44(uStack_350,uStack_354);
  local_214 = CONCAT44(local_348,uStack_34c);
  uStack_20c = CONCAT44(uStack_340,uStack_344);
  local_204 = uStack_33c;
  local_200[0] = -0.113554138044166;
  local_200[1] = -0.2151185878184;
  local_200[2] = -0.0510152146250577;
  local_200[3] = -1.07992686223881;
  local_200[4] = -0.248664241213447;
  local_200[5] = 0.0;
  local_200[10] = 0.164022338959433;
  local_200[0xb] = 0.0426421977505659;
  local_200[8] = -0.0905918835751907;
  local_200[9] = -0.219084567203338;
  local_200[6] = -0.0554699315064507;
  local_200[7] = 0.15848184557498;
  local_200[0xc] = 0.25;
  local_200[0xd] = 0.2;
  local_200[0xe] = 1.0;
  local_188 = iVar23;
  local_180 = 0x358dee7a4ad4b81f;
  local_178 = RVar2;
  local_170 = local_320.m_data;
  if (ncells < 1) {
    local_950 = 0.0;
  }
  else {
    local_408 = local_320.m_data;
    uVar32 = (ulong)(uint)ncells;
    uVar33 = 0;
    pdVar25 = local_700;
    pdVar31 = local_710;
    local_400 = a_size;
    local_3f8 = uVar32;
    do {
      local_6f8 = local_280;
      local_168[8] = 0.0;
      local_168[9] = 0.0;
      local_168[6] = 0.0;
      local_168[7] = 0.0;
      local_168[4] = 0.0;
      local_168[5] = 0.0;
      local_168[2] = 0.0;
      local_168[3] = 0.0;
      local_168[0] = 0.0;
      local_168[1] = 0.0;
      lVar35 = (long)((uVar33 << 0x21) * 5) >> 0x1d;
      pdVar27 = (double *)((long)pdVar31 + lVar35);
      paVar28 = local_2d8;
      for (lVar24 = 10; lVar24 != 0; lVar24 = lVar24 + -1) {
        *(double *)paVar28 = *pdVar27;
        pdVar27 = pdVar27 + (ulong)bVar36 * -2 + 1;
        paVar28 = paVar28 + ((ulong)bVar36 * -2 + 1) * 8;
      }
      pdVar27 = (double *)((long)pdVar31 + lVar35);
      pdVar29 = local_c8;
      for (lVar24 = 10; lVar24 != 0; lVar24 = lVar24 + -1) {
        *pdVar29 = *pdVar27;
        pdVar27 = pdVar27 + (ulong)bVar36 * -2 + 1;
        pdVar29 = pdVar29 + (ulong)bVar36 * -2 + 1;
      }
      dVar57 = pdVar25[uVar33];
      uVar37 = SUB84(dVar57,0);
      uVar38 = (undefined4)((ulong)dVar57 >> 0x20);
      dVar46 = local_250[uVar33];
      pdVar27 = local_248 + uVar33 * 9;
      pdVar29 = local_c8 + 10;
      for (lVar24 = 9; lVar24 != 0; lVar24 = lVar24 + -1) {
        *pdVar29 = *pdVar27;
        pdVar27 = pdVar27 + (ulong)bVar36 * -2 + 1;
        pdVar29 = pdVar29 + (ulong)bVar36 * -2 + 1;
      }
      iVar23 = 0;
      if (local_6f8 < local_240) {
        local_3e0 = local_270 / (double)(int)local_264;
        local_3e8 = local_270 / (double)local_264._4_4_;
        local_7d0 = local_270 / (double)local_268;
        iVar23 = 0;
        uVar26 = (ulong)local_238;
        local_678 = dVar46;
        local_670 = dVar57;
        local_3f0 = uVar33;
        local_3d8 = lVar35;
        do {
          local_118[8] = 0.0;
          local_118[9] = 0.0;
          local_118[6] = 0.0;
          local_118[7] = 0.0;
          local_118[4] = 0.0;
          local_118[5] = 0.0;
          local_118[2] = 0.0;
          local_118[3] = 0.0;
          local_118[0] = 0.0;
          local_118[1] = 0.0;
          local_6ec = iVar23;
          if (0 < (int)uVar26) {
            lVar24 = 0;
            do {
              iVar23 = local_188;
              vVar22 = local_280;
              paVar28 = local_2d8;
              pdVar27 = local_590;
              for (lVar35 = 9; dVar57 = local_290, lVar35 != 0; lVar35 = lVar35 + -1) {
                *pdVar27 = *(double *)paVar28;
                paVar28 = paVar28 + ((ulong)bVar36 * -2 + 1) * 8;
                pdVar27 = pdVar27 + (ulong)bVar36 * -2 + 1;
              }
              dVar46 = 0.0;
              lVar35 = 0;
              do {
                dVar46 = dVar46 + *(double *)(local_2d8 + lVar35 * 8);
                lVar35 = lVar35 + 1;
              } while (lVar35 != 9);
              local_3c0 = 1.0 / dVar46;
              lVar35 = 0;
              do {
                local_590[lVar35] = local_590[lVar35] * local_3c0;
                lVar35 = lVar35 + 1;
              } while (lVar35 != 9);
              dVar56 = ((local_6f8 - vVar22) * local_678 + (double)CONCAT44(uVar38,uVar37)) *
                       local_3c0;
              local_5a8 = 0.0;
              dStack_5a0 = 0.0;
              local_5b8 = ZEXT816(0);
              local_5c8 = 0.0;
              dStack_5c0 = 0.0;
              local_5d8 = ZEXT816(0);
              local_598 = 0.0;
              local_7e8._0_8_ = dVar46;
              if (iVar23 == 1) {
                dVar47 = (local_590[8] * -8.990990148011893 * 0.03569643749553795 +
                         local_590[7] * -193.57402609756912 * 0.029399658963956014 +
                         local_590[6] * 6.416557417884642 * 0.030297521662727988 +
                         local_590[5] * 40.177967868388244 * 0.05879931792791203 +
                         local_590[4] * 325.7416777274101 * 0.06250390649415588 +
                         local_590[3] * 284.5180777777778 * 0.9920634920634921 +
                         local_590[2] * -333.11840718023996 * 0.055509297807382736 +
                         local_590[1] * -8.907086482400652 * 0.03125195324707794 +
                         local_590[0] * -8.917195548386884 * 0.49603174603174605 + 0.0) *
                         7483016356.337915;
                dVar6 = (local_590[8] * 2.909776875799999 * 0.03569643749553795 +
                        local_590[7] * 2.9039314774799996 * 0.029399658963956014 +
                        local_590[6] * 5.42075541105 * 0.030297521662727988 +
                        local_590[5] * 3.9370238885880005 * 0.05879931792791203 +
                        local_590[4] * 8.82856346684 * 0.06250390649415588 +
                        local_590[3] * 7.86790675 * 0.9920634920634921 +
                        local_590[2] * -2.751866206719999 * 0.055509297807382736 +
                        local_590[1] * 3.170612178728 * 0.03125195324707794 +
                        local_590[0] * 2.815654471198 * 0.49603174603174605 + 0.0) *
                        332578504726.1296;
                local_878._0_8_ = local_590[4];
                if (dVar47 <= dVar56) {
                  if (dVar56 <= dVar6) {
                    if ((local_290 < 90.0) || (4000.0 < local_290)) {
                      dVar57 = (dVar56 - dVar47) * (3910.0 / (dVar6 - dVar47)) + 90.0;
                    }
                    iVar23 = 200;
                    do {
                      dVar48 = dVar57 * dVar57;
                      dVar6 = dVar57 * dVar48;
                      dVar47 = dVar57 * dVar6;
                      dVar49 = 1.0 / dVar57;
                      dVar58 = dVar47 * 0.0 + dVar6 * 0.0 + dVar48 * 0.0 + dVar57 * 0.0 + 1.5;
                      if (1000.0 <= dVar57) {
                        dVar16 = dVar47 * -1.3506702e-15 +
                                 dVar6 * 2.52426e-11 +
                                 dVar48 * -1.89492033e-07 + dVar57 * 0.0007439885 + 1.92664;
                        dVar19 = dVar47 * -2.86330712e-15 +
                                 dVar6 * 5.87225893e-11 +
                                 dVar48 * -4.9156294e-07 + dVar57 * 0.0021680682 + 3.57316685;
                        dVar17 = dVar49 * -1233.93018 +
                                 dVar47 * -2.27287062e-16 +
                                 dVar6 * 4.4382037e-12 +
                                 dVar48 * -4.19613997e-08 + dVar57 * 0.000306759845 + 2.69757819;
                        dVar50 = dVar49 * -835.033997 +
                                 dVar47 * 3.16550358e-16 +
                                 dVar6 * -2.30789455e-12 +
                                 dVar48 * -1.8779429e-08 + dVar57 * 0.000350032206 + 1.99142337;
                        dVar53 = dVar49 * 29230.8027 +
                                 dVar47 * -8.736103e-17 +
                                 dVar6 * 1.13776685e-12 +
                                 dVar48 * -1.03426778e-09 + dVar57 * -1.37753096e-05 + 1.54205966;
                        dVar44 = dVar49 * -29899.209 +
                                 dVar47 * -1.27832357e-15 +
                                 dVar6 * 3.00249098e-11 +
                                 dVar48 * -2.9100867e-07 + dVar57 * 0.00152814644 + 1.67214561;
                        dVar51 = dVar49 * 111.856713 +
                                 dVar47 * -2.1581707e-15 +
                                 dVar6 * 2.85615925e-11 +
                                 dVar48 * -2.11219383e-07 + dVar57 * 0.00111991006 + 3.0172109;
                        dVar54 = dVar49 * 3683.62875 +
                                 dVar47 * -2.66391752e-16 +
                                 dVar6 * 7.63046685e-12 +
                                 dVar48 * -8.63609193e-08 + dVar57 * 0.00052825224 + 1.86472886;
                        dVar18 = -922.7977;
                        dVar45 = -18006.9609;
                      }
                      else {
                        dVar16 = dVar47 * -4.88971e-13 +
                                 dVar6 * 1.41037875e-09 +
                                 dVar48 * -1.321074e-06 + dVar57 * 0.00070412 + 2.298677;
                        dVar19 = dVar47 * 4.9430295e-13 +
                                 dVar6 * -1.15645138e-09 +
                                 dVar48 * -4.95004193e-08 + dVar57 * 0.0032846129 + 2.38875365;
                        dVar17 = dVar49 * -1005.24902 +
                                 dVar47 * -1.75371078e-13 +
                                 dVar6 * 3.28469308e-10 +
                                 dVar48 * -1.91871682e-07 + dVar57 * 0.000563743175 + 2.2129364;
                        dVar50 = dVar49 * -1012.52087 +
                                 dVar47 * 8.26974448e-14 +
                                 dVar6 * -2.36885858e-11 +
                                 dVar48 * -2.71433843e-07 + dVar57 * 0.000412472087 + 2.29812431;
                        dVar53 = dVar49 * 29147.6445 +
                                 dVar47 * 7.78139272e-14 +
                                 dVar6 * -4.00710797e-10 +
                                 dVar48 * 8.07010567e-07 + dVar57 * -0.000819083245 + 1.94642878;
                        dVar44 = dVar49 * -30208.1133 +
                                 dVar47 * -5.01317694e-13 +
                                 dVar6 * 1.74214532e-09 +
                                 dVar48 * -2.11823211e-06 + dVar57 * 0.00173749123 + 2.38684249;
                        dVar51 = dVar49 * 294.80804 +
                                 dVar47 * 1.85845025e-12 +
                                 dVar6 * -6.06909735e-09 +
                                 dVar48 * 7.05276303e-06 + dVar57 * -0.00237456025 + 3.30179801;
                        dVar54 = dVar49 * 3346.30913 +
                                 dVar47 * 4.12474758e-13 +
                                 dVar6 * -1.44963411e-09 +
                                 dVar48 * 2.1758823e-06 + dVar57 * -0.0016127247 + 3.12530561;
                        dVar18 = -1020.9;
                        dVar45 = -17663.1465;
                      }
                      if (1000.0 <= dVar57) {
                        dVar12 = dVar6 * -9.23157818e-12 +
                                 dVar48 * -5.63382869e-08 + dVar57 * 0.000700064411 + 1.99142337;
                        dVar13 = dVar6 * 1.77528148e-11 +
                                 dVar48 * -1.25884199e-07 + dVar57 * 0.000613519689 + 2.69757819;
                        dVar7 = dVar47 * -1.43165356e-14 +
                                dVar6 * 2.34890357e-10 +
                                dVar48 * -1.47468882e-06 + dVar57 * 0.00433613639 + 3.57316685;
                        dVar8 = dVar47 * -6.753351e-15 +
                                dVar6 * 1.009704e-10 +
                                dVar48 * -5.684761e-07 + dVar57 * 0.001487977 + 1.92664;
                        dVar52 = dVar47 * -1.33195876e-15 +
                                 dVar6 * 3.05218674e-11 +
                                 dVar48 * -2.59082758e-07 + dVar57 * 0.00105650448 + 1.86472886;
                        dVar55 = dVar47 * -1.07908535e-14 +
                                 dVar6 * 1.1424637e-10 +
                                 dVar48 * -6.3365815e-07 + dVar57 * 0.00223982013 + 3.0172109;
                        dVar9 = dVar47 * -6.39161787e-15 +
                                dVar6 * 1.20099639e-10 +
                                dVar48 * -8.73026011e-07 + dVar57 * 0.00305629289 + 1.67214561;
                        dVar10 = dVar47 * -4.3680515e-16 +
                                 dVar6 * 4.55106742e-12 +
                                 dVar48 * -3.10280335e-09 + dVar57 * -2.75506191e-05 + 1.54205966;
                        dVar6 = 1.58275179e-15;
                        dVar48 = -1.13643531e-15;
                      }
                      else {
                        dVar12 = dVar6 * -9.47543433e-11 +
                                 dVar48 * -8.14301529e-07 + dVar57 * 0.000824944174 + 2.29812431;
                        dVar13 = dVar6 * 1.31387723e-09 +
                                 dVar48 * -5.75615047e-07 + dVar57 * 0.00112748635 + 2.2129364;
                        dVar7 = dVar47 * 2.47151475e-12 +
                                dVar6 * -4.62580552e-09 +
                                dVar48 * -1.48501258e-07 + dVar57 * 0.00656922581 + 2.38875365;
                        dVar8 = dVar47 * -2.444855e-12 +
                                dVar6 * 5.641515e-09 +
                                dVar48 * -3.963222e-06 + dVar57 * 0.00140824 + 2.298677;
                        dVar52 = dVar47 * 2.06237379e-12 +
                                 dVar6 * -5.79853643e-09 +
                                 dVar48 * 6.52764691e-06 + dVar57 * -0.00322544939 + 3.12530561;
                        dVar55 = dVar47 * 9.29225124e-12 +
                                 dVar6 * -2.42763894e-08 +
                                 dVar48 * 2.11582891e-05 + dVar57 * -0.00474912051 + 3.30179801;
                        dVar9 = dVar47 * -2.50658847e-12 +
                                dVar6 * 6.96858127e-09 +
                                dVar48 * -6.35469633e-06 + dVar57 * 0.00347498246 + 2.38684249;
                        dVar10 = dVar47 * 3.89069636e-13 +
                                 dVar6 * -1.60284319e-09 +
                                 dVar48 * 2.4210317e-06 + dVar57 * -0.00163816649 + 1.94642878;
                        dVar6 = 4.13487224e-13;
                        dVar48 = -8.76855392e-13;
                      }
                      dVar6 = (dVar56 - dVar57 * 83144626.1815324 *
                                        (local_590[8] * (dVar49 * dVar18 + dVar16) *
                                         0.03569643749553795 +
                                        (dVar49 * dVar45 + dVar19) * local_590[7] *
                                        0.029399658963956014 +
                                        local_590[6] * dVar51 * 0.030297521662727988 +
                                        dVar54 * local_590[5] * 0.05879931792791203 +
                                        local_590[4] * dVar53 * 0.06250390649415588 +
                                        (dVar49 * 25471.627 + dVar58) * local_590[3] *
                                        0.9920634920634921 +
                                        dVar44 * local_590[2] * 0.055509297807382736 +
                                        local_590[1] * dVar17 * 0.03125195324707794 +
                                        dVar50 * local_590[0] * 0.49603174603174605 + 0.0)) /
                              ((dVar8 * local_590[8] * 0.03569643749553795 +
                               local_590[7] * dVar7 * 0.029399658963956014 +
                               dVar55 * local_590[6] * 0.030297521662727988 +
                               local_590[5] * dVar52 * 0.05879931792791203 +
                               dVar10 * local_590[4] * 0.06250390649415588 +
                               dVar58 * local_590[3] * 0.9920634920634921 +
                               local_590[2] * dVar9 * 0.055509297807382736 +
                               (dVar47 * dVar48 + dVar13) * local_590[1] * 0.03125195324707794 +
                               local_590[0] * (dVar47 * dVar6 + dVar12) * 0.49603174603174605 + 0.0)
                              * 83144626.1815324);
                      dVar47 = 100.0;
                      if ((dVar6 <= 100.0) && (dVar47 = -100.0, -100.0 <= dVar6)) {
                        if (ABS(dVar6) < 1e-06) break;
                        dVar47 = dVar6;
                        if ((dVar57 + dVar6 == dVar57) && (!NAN(dVar57 + dVar6) && !NAN(dVar57)))
                        break;
                      }
                      dVar57 = dVar57 + dVar47;
                      iVar23 = iVar23 + -1;
                    } while (iVar23 != 0);
                  }
                  else {
                    dVar57 = (dVar6 - dVar56) /
                             ((local_590[8] * 3.516178144 * 0.03569643749553795 +
                              local_590[7] * 8.690641024400003 * 0.029399658963956014 +
                              local_590[6] * 6.387270204000001 * 0.030297521662727988 +
                              local_590[5] * 3.55784072304 * 0.05879931792791203 +
                              local_590[4] * 1.56165852648 * 0.06250390649415588 +
                              local_590[3] * 1.5 * 0.9920634920634921 +
                              local_590[2] * 5.97902371528 * 0.055509297807382736 +
                              local_590[1] * 3.98276246984 * 0.03125195324707794 +
                              local_590[0] * 3.70463187832 * 0.49603174603174605 + 0.0) *
                             -83144626.1815324) + 4000.0;
                  }
                }
                else {
                  dVar57 = (dVar47 - dVar56) /
                           ((local_590[8] * 2.39726875929845 * 0.03569643749553795 +
                            local_590[7] * 2.975571056568868 * 0.029399658963956014 +
                            local_590[6] * 3.0286714825412564 * 0.030297521662727988 +
                            local_590[5] * 2.8837972841578914 * 0.05879931792791203 +
                            local_590[4] * 1.817461206843308 * 0.06250390649415588 +
                            local_590[3] * 1.5 * 0.9920634920634921 +
                            local_590[2] * 2.6530335096033126 * 0.055509297807382736 +
                            local_590[1] * 2.3106479756377003 * 0.03125195324707794 +
                            local_590[0] * 2.3657314962556013 * 0.49603174603174605 + 0.0) *
                           -83144626.1815324) + 90.0;
                }
                dVar56 = dVar57 * dVar57;
                dVar6 = dVar57 * dVar56;
                dVar58 = dVar57 * dVar6;
                local_8d8._8_8_ = 0x3fa000418a43bf8c;
                local_8d8._0_8_ = 0x3fdfbefbefbefbf0;
                local_8c8 = 0.055509297807382736;
                dStack_8c0 = 0.9920634920634921;
                uStack_8b0 = 0.05879931792791203;
                local_8b8 = (undefined1  [8])0x3fb000418a43bf8c;
                local_8a8 = 0.030297521662727988;
                dStack_8a0 = 0.029399658963956014;
                local_898 = &DAT_3fa246cdaf410bdd;
                dVar47 = 1.0 / dVar57;
                if (1000.0 <= dVar57) {
                  local_5d8._0_8_ =
                       dVar47 * -835.033997 +
                       dVar58 * 3.16550358e-16 +
                       dVar6 * -2.30789455e-12 +
                       dVar56 * -1.8779429e-08 + dVar57 * 0.000350032206 + 1.99142337;
                  local_5d8._8_8_ =
                       dVar47 * -1233.93018 +
                       dVar58 * -2.27287062e-16 +
                       dVar6 * 4.4382037e-12 +
                       dVar56 * -4.19613997e-08 + dVar57 * 0.000306759845 + 2.69757819;
                  dVar51 = dVar47 * 29230.8027 +
                           dVar58 * -8.736103e-17 +
                           dVar6 * 1.13776685e-12 +
                           dVar56 * -1.03426778e-09 + dVar57 * -1.37753096e-05 + 1.54205966;
                  dVar54 = dVar47 * 3683.62875 +
                           dVar58 * -2.66391752e-16 +
                           dVar6 * 7.63046685e-12 +
                           dVar56 * -8.63609193e-08 + dVar57 * 0.00052825224 + 1.86472886;
                  local_5a8 = dVar47 * 111.856713 +
                              dVar58 * -2.1581707e-15 +
                              dVar6 * 2.85615925e-11 +
                              dVar56 * -2.11219383e-07 + dVar57 * 0.00111991006 + 3.0172109;
                  dStack_5a0 = dVar47 * -18006.9609 +
                               dVar58 * -2.86330712e-15 +
                               dVar6 * 5.87225893e-11 +
                               dVar56 * -4.9156294e-07 + dVar57 * 0.0021680682 + 3.57316685;
                  dVar18 = dVar58 * -1.27832357e-15 +
                           dVar6 * 3.00249098e-11 +
                           dVar56 * -2.9100867e-07 + dVar57 * 0.00152814644 + 1.67214561;
                  dVar45 = dVar58 * -1.3506702e-15 +
                           dVar6 * 2.52426e-11 +
                           dVar56 * -1.89492033e-07 + dVar57 * 0.0007439885 + 1.92664;
                  dVar48 = -29899.209;
                  dVar49 = -922.7977;
                }
                else {
                  local_5d8._0_8_ =
                       dVar47 * -1012.52087 +
                       dVar58 * 8.26974448e-14 +
                       dVar6 * -2.36885858e-11 +
                       dVar56 * -2.71433843e-07 + dVar57 * 0.000412472087 + 2.29812431;
                  local_5d8._8_8_ =
                       dVar47 * -1005.24902 +
                       dVar58 * -1.75371078e-13 +
                       dVar6 * 3.28469308e-10 +
                       dVar56 * -1.91871682e-07 + dVar57 * 0.000563743175 + 2.2129364;
                  dVar51 = dVar47 * 29147.6445 +
                           dVar58 * 7.78139272e-14 +
                           dVar6 * -4.00710797e-10 +
                           dVar56 * 8.07010567e-07 + dVar57 * -0.000819083245 + 1.94642878;
                  dVar54 = dVar47 * 3346.30913 +
                           dVar58 * 4.12474758e-13 +
                           dVar6 * -1.44963411e-09 +
                           dVar56 * 2.1758823e-06 + dVar57 * -0.0016127247 + 3.12530561;
                  local_5a8 = dVar47 * 294.80804 +
                              dVar58 * 1.85845025e-12 +
                              dVar6 * -6.06909735e-09 +
                              dVar56 * 7.05276303e-06 + dVar57 * -0.00237456025 + 3.30179801;
                  dStack_5a0 = dVar47 * -17663.1465 +
                               dVar58 * 4.9430295e-13 +
                               dVar6 * -1.15645138e-09 +
                               dVar56 * -4.95004193e-08 + dVar57 * 0.0032846129 + 2.38875365;
                  dVar18 = dVar58 * -5.01317694e-13 +
                           dVar6 * 1.74214532e-09 +
                           dVar56 * -2.11823211e-06 + dVar57 * 0.00173749123 + 2.38684249;
                  dVar45 = dVar58 * -4.88971e-13 +
                           dVar6 * 1.41037875e-09 +
                           dVar56 * -1.321074e-06 + dVar57 * 0.00070412 + 2.298677;
                  dVar48 = -30208.1133;
                  dVar49 = -1020.9;
                }
                dVar53 = dVar58 * 0.0 + dVar6 * 0.0 + dVar56 * 0.0 + dVar57 * 0.0 + 1.5;
                local_5c8 = dVar47 * dVar48 + dVar18;
                dStack_5c0 = dVar47 * 25471.627 + dVar53;
                local_5b8._8_4_ = SUB84(dVar54,0);
                local_5b8._0_8_ = dVar51;
                local_5b8._12_4_ = (int)((ulong)dVar54 >> 0x20);
                local_598 = dVar47 * dVar49 + dVar45;
                lVar35 = 0;
                do {
                  *(double *)(local_5d8 + lVar35 * 8) =
                       *(double *)(local_8d8 + lVar35 * 8) * dVar57 * 83144626.1815324 *
                       *(double *)(local_5d8 + lVar35 * 8);
                  lVar35 = lVar35 + 1;
                } while (lVar35 != 9);
                if (1000.0 <= dVar57) {
                  dVar45 = dVar6 * -9.23157818e-12 +
                           dVar56 * -5.63382869e-08 + dVar57 * 0.000700064411 + 1.99142337;
                  dVar51 = dVar6 * 1.77528148e-11 +
                           dVar56 * -1.25884199e-07 + dVar57 * 0.000613519689 + 2.69757819;
                  dVar47 = dVar58 * -1.43165356e-14 +
                           dVar6 * 2.34890357e-10 +
                           dVar56 * -1.47468882e-06 + dVar57 * 0.00433613639 + 3.57316685;
                  dVar48 = dVar58 * -6.753351e-15 +
                           dVar6 * 1.009704e-10 +
                           dVar56 * -5.684761e-07 + dVar57 * 0.001487977 + 1.92664;
                  dVar54 = dVar58 * -1.33195876e-15 +
                           dVar6 * 3.05218674e-11 +
                           dVar56 * -2.59082758e-07 + dVar57 * 0.00105650448 + 1.86472886;
                  dVar44 = dVar58 * -1.07908535e-14 +
                           dVar6 * 1.1424637e-10 +
                           dVar56 * -6.3365815e-07 + dVar57 * 0.00223982013 + 3.0172109;
                  dVar49 = dVar58 * -6.39161787e-15 +
                           dVar6 * 1.20099639e-10 +
                           dVar56 * -8.73026011e-07 + dVar57 * 0.00305629289 + 1.67214561;
                  dVar18 = dVar58 * -4.3680515e-16 +
                           dVar6 * 4.55106742e-12 +
                           dVar56 * -3.10280335e-09 + dVar57 * -2.75506191e-05 + 1.54205966;
                  dVar56 = 1.58275179e-15;
                  dVar6 = -1.13643531e-15;
                }
                else {
                  dVar45 = dVar6 * -9.47543433e-11 +
                           dVar56 * -8.14301529e-07 + dVar57 * 0.000824944174 + 2.29812431;
                  dVar51 = dVar6 * 1.31387723e-09 +
                           dVar56 * -5.75615047e-07 + dVar57 * 0.00112748635 + 2.2129364;
                  dVar47 = dVar58 * 2.47151475e-12 +
                           dVar6 * -4.62580552e-09 +
                           dVar56 * -1.48501258e-07 + dVar57 * 0.00656922581 + 2.38875365;
                  dVar48 = dVar58 * -2.444855e-12 +
                           dVar6 * 5.641515e-09 +
                           dVar56 * -3.963222e-06 + dVar57 * 0.00140824 + 2.298677;
                  dVar54 = dVar58 * 2.06237379e-12 +
                           dVar6 * -5.79853643e-09 +
                           dVar56 * 6.52764691e-06 + dVar57 * -0.00322544939 + 3.12530561;
                  dVar44 = dVar58 * 9.29225124e-12 +
                           dVar6 * -2.42763894e-08 +
                           dVar56 * 2.11582891e-05 + dVar57 * -0.00474912051 + 3.30179801;
                  dVar49 = dVar58 * -2.50658847e-12 +
                           dVar6 * 6.96858127e-09 +
                           dVar56 * -6.35469633e-06 + dVar57 * 0.00347498246 + 2.38684249;
                  dVar18 = dVar58 * 3.89069636e-13 +
                           dVar6 * -1.60284319e-09 +
                           dVar56 * 2.4210317e-06 + dVar57 * -0.00163816649 + 1.94642878;
                  dVar56 = 4.13487224e-13;
                  dVar6 = -8.76855392e-13;
                }
                local_860 = (local_590[8] * dVar48 * 0.03569643749553795 +
                            local_590[7] * dVar47 * 0.029399658963956014 +
                            local_590[6] * dVar44 * 0.030297521662727988 +
                            local_590[5] * dVar54 * 0.05879931792791203 +
                            local_590[4] * dVar18 * 0.06250390649415588 +
                            local_590[3] * dVar53 * 0.9920634920634921 +
                            local_590[2] * dVar49 * 0.055509297807382736 +
                            local_590[1] * (dVar58 * dVar6 + dVar51) * 0.03125195324707794 +
                            local_590[0] * (dVar58 * dVar56 + dVar45) * 0.49603174603174605 + 0.0) *
                            83144626.1815324;
              }
              else if (iVar23 == 2) {
                local_858._0_8_ = 0x3fdfbefbefbefbf0;
                local_858._8_8_ = 0x3fa000418a43bf8c;
                local_848 = 0.055509297807382736;
                auStack_840._0_8_ = 0x3fefbefbefbefbf0;
                auStack_840._8_8_ = 0x3fb000418a43bf8c;
                dStack_830 = 0.05879931792791203;
                local_828 = 0.030297521662727988;
                dStack_820 = 0.029399658963956014;
                local_818 = &DAT_3fa246cdaf410bdd;
                local_8d8._0_8_ = 0xc01fab354f516f0e;
                local_8d8._8_8_ = 0xc01fa0db476237c9;
                local_8c8 = -332.11840718023996;
                dStack_8c0 = 285.5180777777778;
                local_8b8 = (undefined1  [8])0x40746bdde976f65e;
                uStack_8b0 = 41.177967868388244;
                local_8a8 = 7.416557417884642;
                dStack_8a0 = -192.57402609756912;
                local_898 = (undefined1 *)0xc01ff6c61f117a25;
                lVar35 = 0;
                do {
                  *(double *)(local_660 + lVar35 * 8 + -8) =
                       local_590[lVar35] * *(double *)(local_8d8 + lVar35 * 8) *
                       *(double *)(local_858 + lVar35 * 8);
                  lVar35 = lVar35 + 1;
                } while (lVar35 != 9);
                dVar6 = 0.0;
                lVar35 = 0;
                do {
                  dVar6 = dVar6 + *(double *)(local_660 + lVar35 * 8 + -8);
                  lVar35 = lVar35 + 1;
                } while (lVar35 != 9);
                local_858._0_8_ = 0x3fdfbefbefbefbf0;
                local_858._8_8_ = 0x3fa000418a43bf8c;
                local_848 = 0.055509297807382736;
                auStack_840._0_8_ = 0x3fefbefbefbefbf0;
                auStack_840._8_8_ = 0x3fb000418a43bf8c;
                dStack_830 = 0.05879931792791203;
                local_828 = 0.030297521662727988;
                dStack_820 = 0.029399658963956014;
                local_818 = &DAT_3fa246cdaf410bdd;
                local_8d8._8_8_ = 0x4010aeb4f57fbe89;
                local_8d8._0_8_ = 0x400e8675d9f50d7c;
                local_8c8 = -1.751866206720001;
                dStack_8c0 = 8.86790675;
                local_8b8 = (undefined1  [8])0x4023a839788179f3;
                uStack_8b0 = 4.937023888588;
                local_8a8 = 6.420755411050001;
                dStack_8a0 = 3.9039314774799996;
                local_898 = (undefined1 *)0x400f47391941be92;
                lVar35 = 0;
                do {
                  *(double *)(local_660 + lVar35 * 8 + -8) =
                       local_590[lVar35] * *(double *)(local_8d8 + lVar35 * 8) *
                       *(double *)(local_858 + lVar35 * 8);
                  lVar35 = lVar35 + 1;
                } while (lVar35 != 9);
                dVar47 = 0.0;
                lVar35 = 0;
                do {
                  dVar47 = dVar47 + *(double *)(local_660 + lVar35 * 8 + -8);
                  lVar35 = lVar35 + 1;
                } while (lVar35 != 9);
                dVar6 = dVar6 * 7483016356.337915;
                dVar47 = dVar47 * 332578504726.1296;
                if (dVar6 <= dVar56) {
                  if (dVar56 <= dVar47) {
                    if ((local_290 < 90.0) || (4000.0 < local_290)) {
                      dVar57 = (dVar56 - dVar6) * (3910.0 / (dVar47 - dVar6)) + 90.0;
                    }
                    iVar23 = 0;
                    do {
                      dVar58 = dVar57 * dVar57;
                      dVar47 = dVar57 * dVar58;
                      dVar6 = dVar57 * dVar47;
                      local_858._0_8_ = 0x3fdfbefbefbefbf0;
                      local_858._8_8_ = 0x3fa000418a43bf8c;
                      local_848 = 0.055509297807382736;
                      auStack_840._0_8_ = 0x3fefbefbefbefbf0;
                      auStack_840._8_8_ = 0x3fb000418a43bf8c;
                      dStack_830 = 0.05879931792791203;
                      local_828 = 0.030297521662727988;
                      dStack_820 = 0.029399658963956014;
                      local_818 = &DAT_3fa246cdaf410bdd;
                      dVar48 = 1.0 / dVar57;
                      if (1000.0 <= dVar57) {
                        dVar45 = dVar48 * -835.033997 +
                                 dVar6 * 3.16550358e-16 +
                                 dVar47 * -2.30789455e-12 +
                                 dVar58 * -1.8779429e-08 + dVar57 * 0.000350032206 + 2.99142337;
                        dVar51 = dVar48 * -1233.93018 +
                                 dVar6 * -2.27287062e-16 +
                                 dVar47 * 4.4382037e-12 +
                                 dVar58 * -4.19613997e-08 + dVar57 * 0.000306759845 + 3.69757819;
                        local_8b8 = (undefined1  [8])
                                    (dVar48 * 29230.8027 +
                                    dVar6 * -8.736103e-17 +
                                    dVar47 * 1.13776685e-12 +
                                    dVar58 * -1.03426778e-09 + dVar57 * -1.37753096e-05 + 2.54205966
                                    );
                        uStack_8b0 = dVar48 * 3683.62875 +
                                     dVar6 * -2.66391752e-16 +
                                     dVar47 * 7.63046685e-12 +
                                     dVar58 * -8.63609193e-08 + dVar57 * 0.00052825224 + 2.86472886;
                        local_8a8 = dVar48 * 111.856713 +
                                    dVar6 * -2.1581707e-15 +
                                    dVar47 * 2.85615925e-11 +
                                    dVar58 * -2.11219383e-07 + dVar57 * 0.00111991006 + 4.0172109;
                        dStack_8a0 = dVar48 * -18006.9609 +
                                     dVar6 * -2.86330712e-15 +
                                     dVar47 * 5.87225893e-11 +
                                     dVar58 * -4.9156294e-07 + dVar57 * 0.0021680682 + 4.57316685;
                        dVar54 = dVar6 * -1.27832357e-15 +
                                 dVar47 * 3.00249098e-11 +
                                 dVar58 * -2.9100867e-07 + dVar57 * 0.00152814644 + 2.67214561;
                        dVar53 = dVar6 * -1.3506702e-15 +
                                 dVar47 * 2.52426e-11 +
                                 dVar58 * -1.89492033e-07 + dVar57 * 0.0007439885 + 2.92664;
                        dVar49 = -29899.209;
                        dVar18 = -922.7977;
                      }
                      else {
                        dVar45 = dVar48 * -1012.52087 +
                                 dVar6 * 8.26974448e-14 +
                                 dVar47 * -2.36885858e-11 +
                                 dVar58 * -2.71433843e-07 + dVar57 * 0.000412472087 + 3.29812431;
                        dVar51 = dVar48 * -1005.24902 +
                                 dVar6 * -1.75371078e-13 +
                                 dVar47 * 3.28469308e-10 +
                                 dVar58 * -1.91871682e-07 + dVar57 * 0.000563743175 + 3.2129364;
                        local_8b8 = (undefined1  [8])
                                    (dVar48 * 29147.6445 +
                                    dVar6 * 7.78139272e-14 +
                                    dVar47 * -4.00710797e-10 +
                                    dVar58 * 8.07010567e-07 + dVar57 * -0.000819083245 + 2.94642878)
                        ;
                        uStack_8b0 = dVar48 * 3346.30913 +
                                     dVar6 * 4.12474758e-13 +
                                     dVar47 * -1.44963411e-09 +
                                     dVar58 * 2.1758823e-06 + dVar57 * -0.0016127247 + 4.12530561;
                        local_8a8 = dVar48 * 294.80804 +
                                    dVar6 * 1.85845025e-12 +
                                    dVar47 * -6.06909735e-09 +
                                    dVar58 * 7.05276303e-06 + dVar57 * -0.00237456025 + 4.30179801;
                        dStack_8a0 = dVar48 * -17663.1465 +
                                     dVar6 * 4.9430295e-13 +
                                     dVar47 * -1.15645138e-09 +
                                     dVar58 * -4.95004193e-08 + dVar57 * 0.0032846129 + 3.38875365;
                        dVar54 = dVar6 * -5.01317694e-13 +
                                 dVar47 * 1.74214532e-09 +
                                 dVar58 * -2.11823211e-06 + dVar57 * 0.00173749123 + 3.38684249;
                        dVar53 = dVar6 * -4.88971e-13 +
                                 dVar47 * 1.41037875e-09 +
                                 dVar58 * -1.321074e-06 + dVar57 * 0.00070412 + 3.298677;
                        dVar49 = -30208.1133;
                        dVar18 = -1020.9;
                      }
                      dVar44 = dVar6 * 0.0 + dVar47 * 0.0 + dVar58 * 0.0 + dVar57 * 0.0 + 2.5;
                      local_8d8._8_4_ = SUB84(dVar51,0);
                      local_8d8._0_8_ = dVar45;
                      local_8d8._12_4_ = (int)((ulong)dVar51 >> 0x20);
                      local_8c8 = dVar48 * dVar49 + dVar54;
                      dStack_8c0 = dVar48 * 25471.627 + dVar44;
                      local_898 = (undefined1 *)(dVar48 * dVar18 + dVar53);
                      lVar35 = 0;
                      do {
                        *(double *)(local_660 + lVar35 * 8 + -8) =
                             local_590[lVar35] * *(double *)(local_8d8 + lVar35 * 8) *
                             *(double *)(local_858 + lVar35 * 8);
                        lVar35 = lVar35 + 1;
                      } while (lVar35 != 9);
                      dVar48 = 0.0;
                      lVar35 = 0;
                      do {
                        dVar48 = dVar48 + *(double *)(local_660 + lVar35 * 8 + -8);
                        lVar35 = lVar35 + 1;
                      } while (lVar35 != 9);
                      local_858._0_8_ = 0x3fdfbefbefbefbf0;
                      local_858._8_8_ = 0x3fa000418a43bf8c;
                      local_848 = 0.055509297807382736;
                      auStack_840._0_8_ = 0x3fefbefbefbefbf0;
                      auStack_840._8_8_ = 0x3fb000418a43bf8c;
                      dStack_830 = 0.05879931792791203;
                      local_828 = 0.030297521662727988;
                      dStack_820 = 0.029399658963956014;
                      local_818 = &DAT_3fa246cdaf410bdd;
                      if (1000.0 <= dVar57) {
                        dVar45 = dVar6 * 1.58275179e-15 +
                                 dVar47 * -9.23157818e-12 +
                                 dVar58 * -5.63382869e-08 + dVar57 * 0.000700064411 + 2.99142337;
                        dVar51 = dVar6 * -1.13643531e-15 +
                                 dVar47 * 1.77528148e-11 +
                                 dVar58 * -1.25884199e-07 + dVar57 * 0.000613519689 + 3.69757819;
                        local_8b8 = (undefined1  [8])
                                    (dVar6 * -4.3680515e-16 +
                                    dVar47 * 4.55106742e-12 +
                                    dVar58 * -3.10280335e-09 + dVar57 * -2.75506191e-05 + 2.54205966
                                    );
                        uStack_8b0 = dVar6 * -1.33195876e-15 +
                                     dVar47 * 3.05218674e-11 +
                                     dVar58 * -2.59082758e-07 + dVar57 * 0.00105650448 + 2.86472886;
                        local_8a8 = dVar6 * -1.07908535e-14 +
                                    dVar47 * 1.1424637e-10 +
                                    dVar58 * -6.3365815e-07 + dVar57 * 0.00223982013 + 4.0172109;
                        dStack_8a0 = dVar6 * -1.43165356e-14 +
                                     dVar47 * 2.34890357e-10 +
                                     dVar58 * -1.47468882e-06 + dVar57 * 0.00433613639 + 4.57316685;
                        dVar49 = dVar47 * 1.20099639e-10 +
                                 dVar58 * -8.73026011e-07 + dVar57 * 0.00305629289 + 2.67214561;
                        dVar18 = dVar47 * 1.009704e-10 +
                                 dVar58 * -5.684761e-07 + dVar57 * 0.001487977 + 2.92664;
                        dVar47 = -6.39161787e-15;
                        dVar58 = -6.753351e-15;
                      }
                      else {
                        dVar45 = dVar6 * 4.13487224e-13 +
                                 dVar47 * -9.47543433e-11 +
                                 dVar58 * -8.14301529e-07 + dVar57 * 0.000824944174 + 3.29812431;
                        dVar51 = dVar6 * -8.76855392e-13 +
                                 dVar47 * 1.31387723e-09 +
                                 dVar58 * -5.75615047e-07 + dVar57 * 0.00112748635 + 3.2129364;
                        local_8b8 = (undefined1  [8])
                                    (dVar6 * 3.89069636e-13 +
                                    dVar47 * -1.60284319e-09 +
                                    dVar58 * 2.4210317e-06 + dVar57 * -0.00163816649 + 2.94642878);
                        uStack_8b0 = dVar6 * 2.06237379e-12 +
                                     dVar47 * -5.79853643e-09 +
                                     dVar58 * 6.52764691e-06 + dVar57 * -0.00322544939 + 4.12530561;
                        local_8a8 = dVar6 * 9.29225124e-12 +
                                    dVar47 * -2.42763894e-08 +
                                    dVar58 * 2.11582891e-05 + dVar57 * -0.00474912051 + 4.30179801;
                        dStack_8a0 = dVar6 * 2.47151475e-12 +
                                     dVar47 * -4.62580552e-09 +
                                     dVar58 * -1.48501258e-07 + dVar57 * 0.00656922581 + 3.38875365;
                        dVar49 = dVar47 * 6.96858127e-09 +
                                 dVar58 * -6.35469633e-06 + dVar57 * 0.00347498246 + 3.38684249;
                        dVar18 = dVar47 * 5.641515e-09 +
                                 dVar58 * -3.963222e-06 + dVar57 * 0.00140824 + 3.298677;
                        dVar47 = -2.50658847e-12;
                        dVar58 = -2.444855e-12;
                      }
                      local_8d8._8_4_ = SUB84(dVar51,0);
                      local_8d8._0_8_ = dVar45;
                      local_8d8._12_4_ = (int)((ulong)dVar51 >> 0x20);
                      local_8c8 = dVar6 * dVar47 + dVar49;
                      dStack_8c0 = dVar44;
                      local_898 = (undefined1 *)(dVar6 * dVar58 + dVar18);
                      lVar35 = 0;
                      do {
                        *(double *)(local_660 + lVar35 * 8 + -8) =
                             *(double *)(local_8d8 + lVar35 * 8) * local_590[lVar35] *
                             *(double *)(local_858 + lVar35 * 8);
                        lVar35 = lVar35 + 1;
                      } while (lVar35 != 9);
                      dVar6 = 0.0;
                      lVar35 = 0;
                      do {
                        dVar6 = dVar6 + *(double *)(local_660 + lVar35 * 8 + -8);
                        lVar35 = lVar35 + 1;
                      } while (lVar35 != 9);
                      dVar6 = (dVar56 - dVar57 * 83144626.1815324 * dVar48) /
                              (dVar6 * 83144626.1815324);
                      dVar47 = 100.0;
                      if ((dVar6 <= 100.0) && (dVar47 = -100.0, -100.0 <= dVar6)) {
                        if (ABS(dVar6) < 1e-06) break;
                        dVar47 = dVar6;
                        if ((dVar57 + dVar6 == dVar57) && (!NAN(dVar57 + dVar6) && !NAN(dVar57)))
                        break;
                      }
                      dVar57 = dVar57 + dVar47;
                      iVar23 = iVar23 + 1;
                    } while (iVar23 != 200);
                  }
                  else {
                    local_858._0_8_ = 0x3fdfbefbefbefbf0;
                    local_858._8_8_ = 0x3fa000418a43bf8c;
                    local_848 = 0.055509297807382736;
                    auStack_840._0_8_ = 0x3fefbefbefbefbf0;
                    auStack_840._8_8_ = 0x3fb000418a43bf8c;
                    dStack_830 = 0.05879931792791203;
                    local_828 = 0.030297521662727988;
                    dStack_820 = 0.029399658963956014;
                    local_818 = &DAT_3fa246cdaf410bdd;
                    local_8d8._8_8_ = 0x4013ee5948eecbc4;
                    local_8d8._0_8_ = 0x4012d18b04e469ef;
                    local_8c8 = 6.979023715279999;
                    dStack_8c0 = 2.5;
                    local_8b8 = (undefined1  [8])0x40047e46d356025b;
                    uStack_8b0 = 4.557840723039999;
                    local_8a8 = 7.387270204000001;
                    dStack_8a0 = 9.690641024400003;
                    local_898 = (undefined1 *)0x4012109100dd8f57;
                    lVar35 = 0;
                    do {
                      *(double *)(local_660 + lVar35 * 8 + -8) =
                           *(double *)(local_8d8 + lVar35 * 8) * local_590[lVar35] *
                           *(double *)(local_858 + lVar35 * 8);
                      lVar35 = lVar35 + 1;
                    } while (lVar35 != 9);
                    dVar57 = 0.0;
                    lVar35 = 0;
                    do {
                      dVar57 = dVar57 + *(double *)(local_660 + lVar35 * 8 + -8);
                      lVar35 = lVar35 + 1;
                    } while (lVar35 != 9);
                    dVar57 = (dVar47 - dVar56) / (dVar57 * -83144626.1815324) + 4000.0;
                  }
                }
                else {
                  local_858._0_8_ = 0x3fdfbefbefbefbf0;
                  local_858._8_8_ = 0x3fa000418a43bf8c;
                  local_848 = 0.055509297807382736;
                  auStack_840._0_8_ = 0x3fefbefbefbefbf0;
                  auStack_840._8_8_ = 0x3fb000418a43bf8c;
                  dStack_830 = 0.05879931792791203;
                  local_828 = 0.030297521662727988;
                  dStack_820 = 0.029399658963956014;
                  local_818 = &DAT_3fa246cdaf410bdd;
                  local_8d8._8_8_ = 0x400a7c35017f75d1;
                  local_8d8._0_8_ = 0x400aed04a27c4796;
                  local_8c8 = 3.6530335096033126;
                  dStack_8c0 = 2.5;
                  local_8b8 = (undefined1  [8])0x40068a2919e92027;
                  uStack_8b0 = 3.8837972841578914;
                  local_8a8 = 4.028671482541256;
                  dStack_8a0 = 3.975571056568868;
                  local_898 = (undefined1 *)0x400b2d9b3e474653;
                  lVar35 = 0;
                  do {
                    *(double *)(local_660 + lVar35 * 8 + -8) =
                         *(double *)(local_8d8 + lVar35 * 8) * local_590[lVar35] *
                         *(double *)(local_858 + lVar35 * 8);
                    lVar35 = lVar35 + 1;
                  } while (lVar35 != 9);
                  dVar57 = 0.0;
                  lVar35 = 0;
                  do {
                    dVar57 = dVar57 + *(double *)(local_660 + lVar35 * 8 + -8);
                    lVar35 = lVar35 + 1;
                  } while (lVar35 != 9);
                  dVar57 = (dVar6 - dVar56) / (dVar57 * -83144626.1815324) + 90.0;
                }
                dVar47 = dVar57 * dVar57;
                dVar6 = dVar57 * dVar47;
                dVar56 = dVar57 * dVar6;
                local_8d8._8_8_ = 0x3fa000418a43bf8c;
                local_8d8._0_8_ = 0x3fdfbefbefbefbf0;
                local_8c8 = 0.055509297807382736;
                dStack_8c0 = 0.9920634920634921;
                uStack_8b0 = 0.05879931792791203;
                local_8b8 = (undefined1  [8])0x3fb000418a43bf8c;
                local_8a8 = 0.030297521662727988;
                dStack_8a0 = 0.029399658963956014;
                local_898 = &DAT_3fa246cdaf410bdd;
                dVar58 = 1.0 / dVar57;
                if (1000.0 <= dVar57) {
                  dVar18 = dVar58 * -835.033997 +
                           dVar56 * 3.16550358e-16 +
                           dVar6 * -2.30789455e-12 +
                           dVar47 * -1.8779429e-08 + dVar57 * 0.000350032206 + 2.99142337;
                  dVar45 = dVar58 * -1233.93018 +
                           dVar56 * -2.27287062e-16 +
                           dVar6 * 4.4382037e-12 +
                           dVar47 * -4.19613997e-08 + dVar57 * 0.000306759845 + 3.69757819;
                  local_5b8._0_8_ =
                       dVar58 * 29230.8027 +
                       dVar56 * -8.736103e-17 +
                       dVar6 * 1.13776685e-12 +
                       dVar47 * -1.03426778e-09 + dVar57 * -1.37753096e-05 + 2.54205966;
                  local_5b8._8_8_ =
                       dVar58 * 3683.62875 +
                       dVar56 * -2.66391752e-16 +
                       dVar6 * 7.63046685e-12 +
                       dVar47 * -8.63609193e-08 + dVar57 * 0.00052825224 + 2.86472886;
                  local_5a8 = dVar58 * 111.856713 +
                              dVar56 * -2.1581707e-15 +
                              dVar6 * 2.85615925e-11 +
                              dVar47 * -2.11219383e-07 + dVar57 * 0.00111991006 + 4.0172109;
                  dStack_5a0 = dVar58 * -18006.9609 +
                               dVar56 * -2.86330712e-15 +
                               dVar6 * 5.87225893e-11 +
                               dVar47 * -4.9156294e-07 + dVar57 * 0.0021680682 + 4.57316685;
                  dVar51 = dVar56 * -1.27832357e-15 +
                           dVar6 * 3.00249098e-11 +
                           dVar47 * -2.9100867e-07 + dVar57 * 0.00152814644 + 2.67214561;
                  dVar54 = dVar56 * -1.3506702e-15 +
                           dVar6 * 2.52426e-11 +
                           dVar47 * -1.89492033e-07 + dVar57 * 0.0007439885 + 2.92664;
                  dVar48 = -29899.209;
                  dVar49 = -922.7977;
                }
                else {
                  dVar18 = dVar58 * -1012.52087 +
                           dVar56 * 8.26974448e-14 +
                           dVar6 * -2.36885858e-11 +
                           dVar47 * -2.71433843e-07 + dVar57 * 0.000412472087 + 3.29812431;
                  dVar45 = dVar58 * -1005.24902 +
                           dVar56 * -1.75371078e-13 +
                           dVar6 * 3.28469308e-10 +
                           dVar47 * -1.91871682e-07 + dVar57 * 0.000563743175 + 3.2129364;
                  local_5b8._0_8_ =
                       dVar58 * 29147.6445 +
                       dVar56 * 7.78139272e-14 +
                       dVar6 * -4.00710797e-10 +
                       dVar47 * 8.07010567e-07 + dVar57 * -0.000819083245 + 2.94642878;
                  local_5b8._8_8_ =
                       dVar58 * 3346.30913 +
                       dVar56 * 4.12474758e-13 +
                       dVar6 * -1.44963411e-09 +
                       dVar47 * 2.1758823e-06 + dVar57 * -0.0016127247 + 4.12530561;
                  local_5a8 = dVar58 * 294.80804 +
                              dVar56 * 1.85845025e-12 +
                              dVar6 * -6.06909735e-09 +
                              dVar47 * 7.05276303e-06 + dVar57 * -0.00237456025 + 4.30179801;
                  dStack_5a0 = dVar58 * -17663.1465 +
                               dVar56 * 4.9430295e-13 +
                               dVar6 * -1.15645138e-09 +
                               dVar47 * -4.95004193e-08 + dVar57 * 0.0032846129 + 3.38875365;
                  dVar51 = dVar56 * -5.01317694e-13 +
                           dVar6 * 1.74214532e-09 +
                           dVar47 * -2.11823211e-06 + dVar57 * 0.00173749123 + 3.38684249;
                  dVar54 = dVar56 * -4.88971e-13 +
                           dVar6 * 1.41037875e-09 +
                           dVar47 * -1.321074e-06 + dVar57 * 0.00070412 + 3.298677;
                  dVar48 = -30208.1133;
                  dVar49 = -1020.9;
                }
                dStack_8c0 = dVar56 * 0.0 + dVar6 * 0.0 + dVar47 * 0.0 + dVar57 * 0.0 + 2.5;
                local_5d8._8_4_ = SUB84(dVar45,0);
                local_5d8._0_8_ = dVar18;
                local_5d8._12_4_ = (int)((ulong)dVar45 >> 0x20);
                local_5c8 = dVar58 * dVar48 + dVar51;
                dStack_5c0 = dVar58 * 25471.627 + dStack_8c0;
                local_598 = dVar58 * dVar49 + dVar54;
                lVar35 = 0;
                do {
                  *(double *)(local_5d8 + lVar35 * 8) =
                       *(double *)(local_8d8 + lVar35 * 8) * dVar57 * 83144626.1815324 *
                       *(double *)(local_5d8 + lVar35 * 8);
                  lVar35 = lVar35 + 1;
                } while (lVar35 != 9);
                local_858._8_8_ = 0x3fa000418a43bf8c;
                local_858._0_8_ = 0x3fdfbefbefbefbf0;
                local_848 = 0.055509297807382736;
                auStack_840._8_8_ = 0x3fb000418a43bf8c;
                auStack_840._0_8_ = 0x3fefbefbefbefbf0;
                dStack_830 = 0.05879931792791203;
                local_828 = 0.030297521662727988;
                dStack_820 = 0.029399658963956014;
                local_818 = &DAT_3fa246cdaf410bdd;
                if (1000.0 <= dVar57) {
                  dVar49 = dVar56 * 1.58275179e-15 +
                           dVar6 * -9.23157818e-12 +
                           dVar47 * -5.63382869e-08 + dVar57 * 0.000700064411 + 2.99142337;
                  dVar18 = dVar56 * -1.13643531e-15 +
                           dVar6 * 1.77528148e-11 +
                           dVar47 * -1.25884199e-07 + dVar57 * 0.000613519689 + 3.69757819;
                  dVar45 = dVar56 * -4.3680515e-16 +
                           dVar6 * 4.55106742e-12 +
                           dVar47 * -3.10280335e-09 + dVar57 * -2.75506191e-05 + 2.54205966;
                  dVar51 = dVar56 * -1.33195876e-15 +
                           dVar6 * 3.05218674e-11 +
                           dVar47 * -2.59082758e-07 + dVar57 * 0.00105650448 + 2.86472886;
                  local_8a8 = dVar56 * -1.07908535e-14 +
                              dVar6 * 1.1424637e-10 +
                              dVar47 * -6.3365815e-07 + dVar57 * 0.00223982013 + 4.0172109;
                  dStack_8a0 = dVar56 * -1.43165356e-14 +
                               dVar6 * 2.34890357e-10 +
                               dVar47 * -1.47468882e-06 + dVar57 * 0.00433613639 + 4.57316685;
                  dVar58 = dVar6 * 1.20099639e-10 +
                           dVar47 * -8.73026011e-07 + dVar57 * 0.00305629289 + 2.67214561;
                  dVar48 = dVar6 * 1.009704e-10 +
                           dVar47 * -5.684761e-07 + dVar57 * 0.001487977 + 2.92664;
                  dVar6 = -6.39161787e-15;
                  dVar47 = -6.753351e-15;
                }
                else {
                  dVar49 = dVar56 * 4.13487224e-13 +
                           dVar6 * -9.47543433e-11 +
                           dVar47 * -8.14301529e-07 + dVar57 * 0.000824944174 + 3.29812431;
                  dVar18 = dVar56 * -8.76855392e-13 +
                           dVar6 * 1.31387723e-09 +
                           dVar47 * -5.75615047e-07 + dVar57 * 0.00112748635 + 3.2129364;
                  dVar45 = dVar56 * 3.89069636e-13 +
                           dVar6 * -1.60284319e-09 +
                           dVar47 * 2.4210317e-06 + dVar57 * -0.00163816649 + 2.94642878;
                  dVar51 = dVar56 * 2.06237379e-12 +
                           dVar6 * -5.79853643e-09 +
                           dVar47 * 6.52764691e-06 + dVar57 * -0.00322544939 + 4.12530561;
                  local_8a8 = dVar56 * 9.29225124e-12 +
                              dVar6 * -2.42763894e-08 +
                              dVar47 * 2.11582891e-05 + dVar57 * -0.00474912051 + 4.30179801;
                  dStack_8a0 = dVar56 * 2.47151475e-12 +
                               dVar6 * -4.62580552e-09 +
                               dVar47 * -1.48501258e-07 + dVar57 * 0.00656922581 + 3.38875365;
                  dVar58 = dVar6 * 6.96858127e-09 +
                           dVar47 * -6.35469633e-06 + dVar57 * 0.00347498246 + 3.38684249;
                  dVar48 = dVar6 * 5.641515e-09 +
                           dVar47 * -3.963222e-06 + dVar57 * 0.00140824 + 3.298677;
                  dVar6 = -2.50658847e-12;
                  dVar47 = -2.444855e-12;
                }
                local_8d8._8_4_ = SUB84(dVar18,0);
                local_8d8._0_8_ = dVar49;
                local_8d8._12_4_ = (int)((ulong)dVar18 >> 0x20);
                local_8c8 = dVar56 * dVar6 + dVar58;
                unique0x1000a306 = SUB84(dVar51,0);
                local_8b8 = (undefined1  [8])dVar45;
                unique0x1000a30a = (int)((ulong)dVar51 >> 0x20);
                local_898 = (undefined1 *)(dVar56 * dVar47 + dVar48);
                lVar35 = 0;
                do {
                  *(double *)(local_660 + lVar35 * 8 + -8) =
                       *(double *)(local_8d8 + lVar35 * 8) * local_590[lVar35] *
                       *(double *)(local_858 + lVar35 * 8);
                  lVar35 = lVar35 + 1;
                } while (lVar35 != 9);
                local_860 = 0.0;
                lVar35 = 0;
                do {
                  local_860 = local_860 + *(double *)(local_660 + lVar35 * 8 + -8);
                  lVar35 = lVar35 + 1;
                } while (lVar35 != 9);
                local_860 = local_860 * 83144626.1815324;
              }
              else {
                local_860 = 0.0;
                amrex::Abort_host("Wrong reactor type. Choose between 1 (e) or 2 (h).");
                dVar46 = local_7e8._0_8_;
              }
              local_8d8._0_8_ = 0x3fdfbefbefbefbf0;
              local_8d8._8_8_ = 0x3fa000418a43bf8c;
              local_8c8 = 0.055509297807382736;
              dStack_8c0 = 0.9920634920634921;
              local_8b8 = (undefined1  [8])0x3fb000418a43bf8c;
              uStack_8b0 = 0.05879931792791203;
              local_8a8 = 0.030297521662727988;
              dStack_8a0 = 0.029399658963956014;
              local_898 = &DAT_3fa246cdaf410bdd;
              lVar35 = 0;
              do {
                *(double *)(local_660 + lVar35 * 8 + -8) =
                     local_590[lVar35] * dVar46 * *(double *)(local_8d8 + lVar35 * 8);
                lVar35 = lVar35 + 1;
              } while (lVar35 != 9);
              lVar35 = 0;
              do {
                *(double *)(local_660 + lVar35 * 8 + -8) =
                     *(double *)(local_660 + lVar35 * 8 + -8) * 1000000.0;
                lVar35 = lVar35 + 1;
              } while (lVar35 != 9);
              local_438 = log(dVar57);
              uStack_430 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
              local_858 = ZEXT816(0);
              local_848 = 0.0;
              auStack_840 = ZEXT816(0);
              dStack_830 = 0.0;
              local_828 = 0.0;
              dStack_820 = 0.0;
              local_818 = (undefined1 *)0x0;
              dVar46 = 0.0;
              lVar35 = 0;
              do {
                dVar46 = dVar46 + *(double *)(local_660 + lVar35 * 8 + -8);
                lVar35 = lVar35 + 1;
              } while (lVar35 != 9);
              dVar6 = dVar57 * dVar57;
              dVar56 = dVar57 * dVar6;
              dVar47 = dVar57 * dVar56;
              local_418 = 1.0 / dVar57;
              local_7c8._8_8_ = 0;
              local_7c8._0_8_ = local_418 * 12186.6002121605;
              uStack_410 = 0;
              if (1000.0 <= dVar57) {
                dVar48 = dVar56 * -1.479401233333333e-12 +
                         dVar6 * 2.098069983333333e-08 +
                         dVar57 * -0.0003067598445 +
                         local_438 * -3.69757819 + local_418 * -1233.93018 + 0.5084126000000002;
                dVar49 = dVar56 * 7.692981816666667e-13 +
                         dVar6 * 9.389714483333333e-09 +
                         dVar57 * -0.0003500322055 +
                         local_438 * -2.99142337 + local_418 * -835.033997 + 4.34653354;
                dVar58 = dVar47 * 6.6597938e-17 +
                         dVar56 * -2.54348895e-12 +
                         dVar6 * 4.318045966666667e-08 +
                         dVar57 * -0.00052825224 +
                         local_438 * -2.86472886 + local_418 * 3683.62875 + -2.83691187;
                local_6a8._8_4_ = SUB84(dVar58,0);
                local_6a8._0_8_ =
                     dVar47 * 5.39542675e-16 +
                     dVar56 * -9.520530833333334e-12 +
                     dVar6 * 1.056096916666667e-07 +
                     dVar57 * -0.001119910065 +
                     local_438 * -4.0172109 + local_418 * 111.856713 + 0.2321087500000001;
                local_6a8._12_4_ = (int)((ulong)dVar58 >> 0x20);
                dVar58 = dVar47 * -0.0 +
                         dVar56 * -0.0 +
                         dVar6 * -0.0 +
                         dVar57 * -0.0 + local_438 * -2.5 + local_418 * 25471.627 + 2.960117638;
                local_608._8_4_ = SUB84(dVar58,0);
                local_608._0_8_ =
                     dVar47 * 2.18402575e-17 +
                     dVar56 * -3.792556183333333e-13 +
                     dVar6 * 5.171338916666667e-10 +
                     dVar57 * 1.377530955e-05 +
                     local_438 * -2.54205966 + local_418 * 29230.8027 + -2.37824845;
                local_608._12_4_ = (int)((ulong)dVar58 >> 0x20);
                dVar58 = dVar47 * 7.1582678e-16 +
                         dVar56 * -1.957419641666667e-11 +
                         dVar6 * 2.4578147e-07 +
                         dVar57 * -0.002168068195 +
                         local_438 * -4.57316685 + local_418 * -18006.9609 + 4.072029891;
                local_5f8._8_4_ = SUB84(dVar58,0);
                local_5f8._0_8_ =
                     dVar47 * 3.195808935e-16 +
                     dVar56 * -1.000830325e-11 +
                     dVar6 * 1.455043351666667e-07 +
                     dVar57 * -0.001528146445 +
                     local_438 * -2.67214561 + local_418 * -29899.209 + -4.190671200000001;
                local_5f8._12_4_ = (int)((ulong)dVar58 >> 0x20);
                dVar56 = 5.68217655e-17;
                dVar6 = -7.91375895e-17;
              }
              else {
                dVar48 = dVar56 * -1.094897691666667e-10 +
                         dVar6 * 9.593584116666666e-08 +
                         dVar57 * -0.000563743175 +
                         local_438 * -3.2129364 + local_418 * -1005.24902 + -2.82180119;
                dVar49 = dVar56 * 7.896195275e-12 +
                         dVar6 * 1.357169215e-07 +
                         dVar57 * -0.000412472087 +
                         local_438 * -3.29812431 + local_418 * -1012.52087 + 6.5922184;
                dVar58 = dVar47 * -1.031186895e-13 +
                         dVar56 * 4.832113691666666e-10 +
                         dVar6 * -1.087941151666667e-06 +
                         dVar57 * 0.001612724695 +
                         local_438 * -4.12530561 + local_418 * 3346.30913 + 4.81573857;
                local_6a8._8_4_ = SUB84(dVar58,0);
                local_6a8._0_8_ =
                     dVar47 * -4.646125620000001e-13 +
                     dVar56 * 2.02303245e-09 +
                     dVar6 * -3.526381516666666e-06 +
                     dVar57 * 0.002374560255 +
                     local_438 * -4.30179801 + local_418 * 294.80804 + 0.5851355599999999;
                local_6a8._12_4_ = (int)((ulong)dVar58 >> 0x20);
                dVar58 = dVar47 * -0.0 +
                         dVar56 * -0.0 +
                         dVar6 * -0.0 +
                         dVar57 * -0.0 + local_438 * -2.5 + local_418 * 25471.627 + 2.960117608;
                local_608._8_4_ = SUB84(dVar58,0);
                local_608._0_8_ =
                     dVar47 * -1.94534818e-14 +
                     dVar56 * 1.335702658333333e-10 +
                     dVar6 * -4.035052833333333e-07 +
                     dVar57 * 0.000819083245 +
                     local_438 * -2.94642878 + local_418 * 29147.6445 + -0.01756619999999964;
                local_608._12_4_ = (int)((ulong)dVar58 >> 0x20);
                dVar58 = dVar47 * -1.235757375e-13 +
                         dVar56 * 3.854837933333333e-10 +
                         dVar6 * 2.475020966666667e-08 +
                         dVar57 * -0.003284612905 +
                         local_438 * -3.38875365 + local_418 * -17663.1465 + -3.39660955;
                local_5f8._8_4_ = SUB84(dVar58,0);
                local_5f8._0_8_ =
                     dVar47 * 1.253294235e-13 +
                     dVar56 * -5.807151058333333e-10 +
                     dVar6 * 1.059116055e-06 +
                     dVar57 * -0.00173749123 +
                     local_438 * -3.38684249 + local_418 * -30208.1133 + 0.7966096399999998;
                local_5f8._12_4_ = (int)((ulong)dVar58 >> 0x20);
                dVar56 = 4.38427696e-14;
                dVar6 = -2.06743612e-14;
              }
              dVar48 = dVar47 * dVar56 + dVar48;
              dVar49 = dVar47 * dVar6 + dVar49;
              local_7b8._0_8_ = 1.0 / (local_418 * 12186.6002121605);
              dVar56 = exp(local_438 * 0.6);
              local_878._8_8_ = 0;
              local_878._0_8_ = local_668;
              dVar58 = dVar46 + local_668;
              dVar6 = exp(local_438 * -1.72 + local_418 * -264.088106214317);
              uVar37 = SUB84(dVar49,0);
              uVar39 = (uint)((ulong)dVar49 >> 0x20);
              local_748._8_4_ = local_878._8_4_;
              local_748._0_8_ = local_878._0_8_ * 1.5 + dVar46;
              local_748._12_4_ = local_878._12_4_;
              uVar38 = (undefined4)uStack_430;
              uVar40 = (uint)((ulong)uStack_430 >> 0x20);
              local_788._8_4_ = uVar38;
              local_788._0_8_ = local_438 * 0.0 + local_418 * -22896.3582941147;
              local_788._12_4_ = uVar40;
              dVar46 = local_6a8._8_8_;
              local_7e8._8_4_ = local_6a8._8_4_;
              local_7e8._0_8_ = dVar46;
              local_7e8._12_4_ = local_6a8._12_4_;
              dVar47 = dVar46 * -2.0;
              local_768._8_4_ = uVar38;
              local_768._0_8_ = local_438 * -1.4 + local_418 * -52525.7555766966;
              local_768._12_4_ = uVar40;
              dVar18 = local_5f8._0_8_;
              dVar45 = local_5f8._8_8_;
              dVar44 = dVar18 + (double)local_608._0_8_;
              local_518._8_4_ = uVar38;
              local_518._0_8_ = local_438 * -0.406 + local_418 * -8352.89343569254;
              local_518._12_4_ = uVar40;
              local_4a8._8_4_ = uVar38;
              local_4a8._0_8_ = local_438 * 2.67 + local_418 * -3165.23282791169;
              local_4a8._12_4_ = uVar40;
              local_498._8_4_ = uVar38;
              local_498._0_8_ = local_438 * 1.51 + local_418 * -1726.03316371019;
              local_498._12_4_ = uVar40;
              local_488._8_4_ = uVar38;
              local_488._0_8_ = local_438 * 2.02 + local_418 * -6743.10332178324;
              local_488._12_4_ = uVar40;
              local_758 = local_660;
              local_5e8._8_4_ = local_660._8_4_;
              local_5e8._0_8_ = local_660._8_8_;
              local_5e8._12_4_ = local_660._12_4_;
              dVar6 = dVar6 * ((local_660._8_8_ * 10.0 + local_660._0_8_ * -0.22 + dVar58) /
                              (dVar56 * 1475000.0)) * 636600000.0;
              local_468._8_4_ = uVar37;
              local_468._0_8_ = -((dVar48 + (double)local_608._8_8_) - (double)local_6a8._0_8_);
              local_468._12_4_ = uVar39 ^ 0x80000000;
              uVar41 = (undefined4)uStack_410;
              uVar42 = (undefined4)((ulong)uStack_410 >> 0x20);
              local_7f8._8_4_ = uVar41;
              local_7f8._0_8_ = local_418 * -24370.7831249226;
              local_7f8._12_4_ = uVar42;
              local_428._8_4_ = local_5f8._8_4_;
              local_428._0_8_ = dVar45;
              local_428._12_4_ = local_5f8._12_4_;
              local_548 = -(dVar49 - ((double)local_608._8_8_ + (double)local_608._8_8_));
              dStack_540 = -dVar49;
              local_538._8_4_ = uVar38;
              local_538._0_8_ = local_438 * -0.5;
              local_538._12_4_ = uVar40;
              uVar20 = local_608._12_4_;
              uVar43 = local_608._8_4_;
              local_6e8._8_4_ = uVar43;
              local_6e8._0_8_ = -(((double)local_608._0_8_ + (double)local_608._0_8_) - dVar48);
              uStack_6dc = uVar20 ^ 0x80000000;
              local_528._8_4_ = uVar38;
              local_528._0_8_ = -local_438;
              local_528._12_4_ = uVar40 ^ 0x80000000;
              local_808._8_4_ = uVar43;
              local_808._0_8_ = -(((double)local_608._8_8_ + (double)local_608._0_8_) - dVar46);
              local_808._12_4_ = uVar20 ^ 0x80000000;
              local_6d8._8_8_ = uStack_430;
              local_6d8._0_8_ = local_438 * -2.0;
              local_6c8._8_4_ = uVar43;
              local_6c8._0_8_ = -(((double)local_608._8_8_ - dVar18) + dVar46);
              local_6c8._12_4_ = uVar20 ^ 0x80000000;
              dVar58 = (dVar48 + (double)local_608._8_8_) - (double)local_608._0_8_;
              local_508._8_8_ = -dVar49;
              local_508._0_8_ =
                   -(((dVar49 - (double)local_608._8_8_) + (double)local_608._0_8_) - dVar46);
              local_4f8._8_8_ = -dVar49;
              local_4f8._0_8_ = -(((dVar49 - dVar18) - (double)local_608._8_8_) + dVar46);
              local_6b8._8_4_ = uVar41;
              local_6b8._0_8_ = local_418 * -414.147315957284;
              local_6b8._12_4_ = uVar42;
              local_7a8._8_4_ = uVar37;
              local_7a8._0_8_ =
                   -((-dVar49 - dVar48) + (double)local_608._8_8_ + (double)local_6a8._0_8_);
              local_7a8._12_4_ = uVar39;
              local_4e8._8_4_ = uVar41;
              local_4e8._0_8_ = local_418 * -148.448916412392;
              local_4e8._12_4_ = uVar42;
              local_798._8_8_ = -dVar46;
              local_798._0_8_ = -(dVar47 + (double)local_608._8_8_ + (double)local_6a8._0_8_);
              local_4d8._8_4_ = uVar43;
              local_4d8._0_8_ =
                   -((((double)local_608._0_8_ - dVar48) - dVar46) + (double)local_6a8._0_8_);
              local_4d8._12_4_ = uVar20 ^ 0x80000000;
              local_4c8._8_4_ = uVar41;
              local_4c8._0_8_ = local_418 * 250.098682904946;
              local_4c8._12_4_ = uVar42;
              local_4b8._8_4_ = uVar37;
              local_4b8._0_8_ = -((-dVar48 - dVar18) + dVar46 + (double)local_6a8._0_8_);
              local_4b8._12_4_ = uVar39;
              local_478._8_4_ = uVar41;
              local_478._0_8_ = local_418 * -6029.54208967215;
              local_478._12_4_ = uVar42;
              local_618._8_4_ = local_6a8._8_4_;
              local_618._0_8_ =
                   -((((double)local_6a8._0_8_ + (double)local_6a8._0_8_) - dVar48) - dVar45);
              local_618._12_4_ = local_6a8._12_4_ ^ 0x80000000;
              local_458._8_4_ = uVar41;
              local_458._0_8_ = local_418 * 819.89091359563;
              local_458._12_4_ = uVar42;
              local_3b8._8_4_ = uVar41;
              local_3b8._0_8_ = local_418 * -1997.77016324474;
              local_3b8._12_4_ = uVar42;
              local_778._8_8_ = -(double)local_608._8_8_;
              local_778._0_8_ = -((((double)local_608._8_8_ - dVar18) - dVar46) + dVar45);
              local_448._8_8_ = uStack_410;
              local_448._0_8_ = local_418 * -4000.57249314752;
              local_338 = -((((double)local_608._8_8_ - dVar49) - (double)local_6a8._0_8_) + dVar45)
              ;
              dStack_330 = -(double)local_608._8_8_;
              local_888._0_8_ = dVar6 / (dVar6 + 1.0);
              dVar6 = log10(dVar6);
              dVar48 = exp(dVar57 * -1e+30);
              dVar49 = exp(dVar57 * -1e-30);
              dVar48 = log10(dVar49 * 0.8 + dVar48 * 0.2 + 0.0);
              dVar6 = dVar48 * -0.67 + -0.4 + dVar6;
              dVar6 = dVar6 / (dVar6 * -0.14 + dVar48 * -1.27 + 0.75);
              dVar6 = pow(10.0,dVar48 / (dVar6 * dVar6 + 1.0));
              dVar56 = dVar6 * (double)local_888._0_8_ * dVar56 * 1475000.0;
              dVar6 = exp((double)local_468._0_8_);
              local_888._0_8_ = dVar6 * dVar56 * (double)local_7c8._0_8_;
              dVar6 = exp((double)local_7f8._0_8_);
              dVar49 = local_5e8._0_8_ * 11.0 + (double)local_748._0_8_;
              local_7f8._8_4_ = local_5e8._8_4_;
              local_7f8._0_8_ = dVar49;
              local_7f8._12_4_ = local_5e8._12_4_;
              dVar48 = exp((double)local_788._0_8_);
              dVar48 = dVar48 * (dVar49 / (dVar6 * 295100000000000.0)) * 120200000000.0;
              local_788._0_8_ = dVar48;
              dVar48 = log10(dVar48);
              dVar49 = exp(dVar57 * -1e+30);
              dVar57 = exp(dVar57 * -1e-30);
              dVar57 = log10(dVar57 * 0.5 + dVar49 * 0.5 + 0.0);
              dVar48 = dVar57 * -0.67 + -0.4 + dVar48;
              dVar48 = dVar48 / (dVar48 * -0.14 + dVar57 * -1.27 + 0.75);
              dVar57 = pow(10.0,dVar57 / (dVar48 * dVar48 + 1.0));
              dVar48 = exp(-(dVar47 + dVar45));
              dVar8 = local_630;
              auVar5 = local_640;
              dVar18 = local_640._8_8_;
              local_748._8_4_ = local_640._8_4_;
              local_748._0_8_ = dVar18;
              local_748._12_4_ = local_640._12_4_;
              local_888._0_8_ = (double)local_888._0_8_ * dVar18;
              dVar6 = ((double)local_788._0_8_ / ((double)local_788._0_8_ + 1.0)) * dVar57 *
                      dVar6 * 295100000000000.0;
              dVar57 = local_640._0_8_;
              local_468._8_4_ = SUB84(dVar18 * dVar18,0);
              local_468._0_8_ = dVar57 * dVar57;
              local_468._12_4_ = (int)((ulong)(dVar18 * dVar18) >> 0x20);
              dVar45 = local_630 * dVar6 -
                       dVar6 * dVar48 * (double)local_7b8._0_8_ * dVar57 * dVar57;
              dVar6 = dStack_820 - dVar45;
              dVar48 = exp((double)local_768._0_8_);
              dVar48 = dVar48 * 45770000000000.0 * (double)local_7f8._0_8_;
              local_768._8_4_ = local_878._8_4_;
              local_768._0_8_ = local_878._0_8_ * dVar48;
              local_768._12_4_ = local_878._12_4_;
              dVar49 = exp(local_548);
              local_3d0 = dVar49 * dVar48 * (double)local_7b8._0_8_;
              local_7b8._8_8_ = 0;
              local_7b8._0_8_ = local_858._0_8_;
              dStack_540 = exp((double)local_538._0_8_);
              dStack_540 = dStack_540 * 6165.0;
              local_548 = 3547000000.0;
              local_3c8 = exp((double)local_6e8._0_8_);
              local_788._8_8_ = 0;
              local_788._0_8_ = auStack_840._8_8_;
              dVar48 = exp((double)local_528._0_8_);
              local_538._8_4_ = extraout_XMM0_Dc_00;
              local_538._0_8_ = dVar48;
              local_538._12_4_ = extraout_XMM0_Dd_00;
              dVar48 = exp((double)local_808._0_8_);
              local_528._8_4_ = extraout_XMM0_Dc_01;
              local_528._0_8_ = dVar48;
              local_528._12_4_ = extraout_XMM0_Dd_01;
              dVar48 = exp((double)local_6d8._0_8_);
              local_6d8._8_4_ = extraout_XMM0_Dc_02;
              local_6d8._0_8_ = dVar48;
              local_6d8._12_4_ = extraout_XMM0_Dd_02;
              local_918 = auVar5._0_4_;
              uStack_914 = auVar5._4_4_;
              local_6e8._8_4_ = local_918;
              local_6e8._0_8_ = dVar57;
              uStack_6dc = uStack_914;
              dVar48 = exp((double)local_6c8._0_8_);
              dVar7 = local_848;
              local_6c8._8_4_ = extraout_XMM0_Dc_03;
              local_6c8._0_8_ = dVar48;
              local_6c8._12_4_ = extraout_XMM0_Dd_03;
              dVar48 = exp((double)local_518._0_8_);
              local_808._8_4_ = extraout_XMM0_Dc_04;
              local_808._0_8_ = dVar48;
              local_808._12_4_ = extraout_XMM0_Dd_04;
              dVar46 = exp(-(dVar58 - dVar46));
              dVar49 = local_650._8_8_;
              dVar48 = local_650._0_8_;
              dVar51 = dVar56 * (double)local_758._0_8_ * dVar48 - (double)local_888._0_8_;
              dVar54 = (double)local_768._0_8_ - dVar48 * dVar48 * local_3d0;
              dVar56 = (double)local_808._0_8_ * local_548;
              local_808._8_4_ = local_650._8_4_;
              local_808._0_8_ = dVar49;
              local_808._12_4_ = local_650._12_4_;
              dVar50 = 0.0 - dVar51;
              local_7b8._0_8_ = (double)local_7b8._0_8_ - dVar54;
              dVar16 = (double)local_758._0_8_ * dVar48 * dVar56 - dVar57 * dVar49 * dVar56 * dVar46
              ;
              dVar17 = dVar49 * dVar49 * (double)local_7f8._0_8_ * dStack_540 -
                       (double)local_758._0_8_ *
                       (double)local_7f8._0_8_ * dStack_540 * local_3c8 * (double)local_7c8._0_8_;
              uVar37 = local_788._12_4_;
              dVar46 = dVar48 * (double)local_6e8._0_8_;
              dVar56 = (double)local_758._0_8_ * stack0xfffffffffffff920;
              local_6e8._8_4_ = SUB84(dVar56,0);
              local_6e8._0_8_ = dVar46;
              uStack_6dc = (int)((ulong)dVar56 >> 0x20);
              dVar56 = (double)local_7f8._0_8_ * (double)local_538._0_8_ * 4714000.0;
              dVar58 = (double)local_7f8._0_8_ * (double)local_6d8._0_8_ * 38000000000.0;
              dVar49 = dVar48 * dVar49 * dVar56 -
                       dVar57 * (double)local_7c8._0_8_ * (double)local_528._0_8_ * dVar56;
              dVar53 = dVar46 * dVar58 -
                       (double)local_758._8_8_ *
                       (double)local_7c8._0_8_ * (double)local_6c8._0_8_ * dVar58;
              local_788._8_4_ = local_788._8_4_;
              local_788._0_8_ = (local_788._0_8_ - (dVar17 + dVar17)) - dVar49;
              local_788._12_4_ = uVar37;
              local_6d8._8_8_ = local_758._0_8_;
              local_6d8._0_8_ = local_758._8_8_;
              local_518._8_4_ = SUB84(dVar17,0);
              local_518._0_8_ = dVar16;
              local_518._12_4_ = (int)((ulong)dVar17 >> 0x20);
              local_6c8._8_8_ = 0;
              local_6c8._0_8_ = (dVar50 + dVar17) - dVar16;
              local_768._0_8_ = (((dVar54 + dVar54 + dVar50) - dVar49) - dVar53) - dVar16;
              dVar46 = exp((double)local_4a8._0_8_);
              local_7f8._8_4_ = extraout_XMM0_Dc_05;
              local_7f8._0_8_ = dVar46 * 0.0508;
              local_7f8._12_4_ = extraout_XMM0_Dd_05;
              dVar46 = exp((double)local_508._0_8_);
              local_508._8_4_ = extraout_XMM0_Dc_06;
              local_508._0_8_ = dVar46;
              local_508._12_4_ = extraout_XMM0_Dd_06;
              dVar46 = exp((double)local_498._0_8_);
              local_888._8_4_ = extraout_XMM0_Dc_07;
              local_888._0_8_ = dVar46;
              local_888._12_4_ = extraout_XMM0_Dd_07;
              dVar46 = exp((double)local_4f8._0_8_);
              local_4f8._8_4_ = extraout_XMM0_Dc_08;
              local_4f8._0_8_ = dVar46;
              local_4f8._12_4_ = extraout_XMM0_Dd_08;
              dVar46 = exp((double)local_488._0_8_);
              local_498._8_4_ = extraout_XMM0_Dc_09;
              local_498._0_8_ = dVar46;
              local_498._12_4_ = extraout_XMM0_Dd_09;
              dVar46 = exp(-(dVar44 + dVar47));
              local_488._8_4_ = extraout_XMM0_Dc_10;
              local_488._0_8_ = dVar46;
              local_488._12_4_ = extraout_XMM0_Dd_10;
              dVar46 = exp((double)local_6b8._0_8_);
              local_7c8._8_4_ = extraout_XMM0_Dc_11;
              local_7c8._0_8_ = dVar46;
              local_7c8._12_4_ = extraout_XMM0_Dd_11;
              dVar46 = exp((double)local_7a8._0_8_);
              local_6b8._8_4_ = extraout_XMM0_Dc_12;
              local_6b8._0_8_ = dVar46;
              local_6b8._12_4_ = extraout_XMM0_Dd_12;
              dVar46 = exp((double)local_4e8._0_8_);
              local_4e8._8_4_ = extraout_XMM0_Dc_13;
              local_4e8._0_8_ = dVar46;
              local_4e8._12_4_ = extraout_XMM0_Dd_13;
              dVar46 = exp((double)local_798._0_8_);
              local_4a8._8_4_ = extraout_XMM0_Dc_14;
              local_4a8._0_8_ = dVar46;
              local_4a8._12_4_ = extraout_XMM0_Dd_14;
              dVar46 = dVar18 * (double)local_808._8_8_ * 32500000.0;
              local_798._8_4_ = SUB84(dVar46,0);
              local_798._0_8_ =
                   (double)local_7f8._0_8_ * (double)local_878._0_8_ * (double)local_808._0_8_;
              local_798._12_4_ = (int)((ulong)dVar46 >> 0x20);
              dVar46 = exp((double)local_4d8._0_8_);
              dVar58 = (double)local_798._0_8_ -
                       (double)local_508._0_8_ * (double)local_7f8._0_8_ * (double)local_6e8._0_8_;
              dVar46 = (double)local_798._8_8_ - dVar46 * 32500000.0 * stack0xfffffffffffff920;
              local_798._8_4_ = SUB84(dVar46,0);
              local_798._0_8_ = dVar58;
              local_798._12_4_ = (int)((ulong)dVar46 >> 0x20);
              uVar37 = local_768._12_4_;
              local_768._8_4_ = local_768._8_4_;
              local_768._0_8_ = local_768._0_8_ + dVar58;
              local_768._12_4_ = uVar37;
              dVar46 = exp((double)local_4c8._0_8_);
              local_888._0_8_ = (double)local_888._0_8_ * 216.0;
              dVar46 = dVar46 * 28900000.0;
              local_888._8_4_ = SUB84(dVar46,0);
              local_888._12_4_ = (int)((ulong)dVar46 >> 0x20);
              dVar56 = dVar57 * dVar18;
              local_7f8._8_4_ = SUB84(dVar56,0);
              local_7f8._0_8_ = (double)local_878._0_8_ * dVar57;
              local_7f8._12_4_ = (int)((ulong)dVar56 >> 0x20);
              local_7a8._8_4_ = SUB84(dVar56 * dVar46,0);
              local_7a8._0_8_ = (double)local_878._0_8_ * dVar57 * (double)local_888._0_8_;
              local_7a8._12_4_ = (int)((ulong)(dVar56 * dVar46) >> 0x20);
              dVar46 = exp((double)local_4b8._0_8_);
              dVar54 = (double)local_7a8._0_8_ -
                       dVar48 * (double)local_6d8._0_8_ *
                       (double)local_4f8._0_8_ * (double)local_888._0_8_;
              dVar46 = (double)local_7a8._8_8_ -
                       (double)local_758._8_8_ * (double)local_6d8._8_8_ *
                       dVar46 * (double)local_888._8_8_;
              local_7a8._8_4_ = SUB84(dVar46,0);
              local_7a8._0_8_ = dVar54;
              local_7a8._12_4_ = (int)((ulong)dVar46 >> 0x20);
              local_4b8._8_4_ = local_5e8._8_4_;
              local_4b8._0_8_ = local_5e8._0_8_ * (double)local_808._0_8_;
              local_4b8._12_4_ = local_5e8._12_4_;
              dVar46 = exp((double)local_478._0_8_);
              dVar47 = (double)local_7c8._0_8_ * 16600000.0;
              dVar46 = dVar46 * 420000000.0;
              local_7c8._8_4_ = SUB84(dVar46,0);
              local_7c8._0_8_ = dVar47;
              local_7c8._12_4_ = (int)((ulong)dVar46 >> 0x20);
              dVar56 = dVar48 * (double)local_748._0_8_;
              dVar18 = dVar18 * (double)local_748._8_8_;
              auVar5._8_4_ = SUB84(dVar18,0);
              auVar5._0_8_ = dVar56;
              auVar5._12_4_ = (int)((ulong)dVar18 >> 0x20);
              local_888._8_4_ = SUB84(dVar18 * dVar46,0);
              local_888._0_8_ = dVar56 * dVar47;
              local_888._12_4_ = (int)((ulong)(dVar18 * dVar46) >> 0x20);
              dVar46 = exp((double)local_618._0_8_);
              dVar47 = (double)local_758._0_8_ * (double)local_878._0_8_;
              dVar18 = dVar8 * (double)local_758._0_8_;
              local_758._8_4_ = SUB84(dVar18,0);
              local_758._0_8_ = dVar47;
              local_758._12_4_ = (int)((ulong)dVar18 >> 0x20);
              dVar44 = (double)local_888._0_8_ -
                       (double)local_6b8._0_8_ * (double)local_7c8._0_8_ * dVar47;
              dVar18 = (double)local_888._8_8_ - dVar46 * (double)local_7c8._8_8_ * dVar18;
              uVar37 = (undefined4)((ulong)dVar18 >> 0x20);
              dVar46 = (double)local_7b8._0_8_ - local_798._0_8_;
              local_7b8._8_4_ = local_798._8_4_;
              local_7b8._0_8_ = local_798._8_8_;
              local_7b8._12_4_ = local_798._12_4_;
              local_478._8_4_ = local_7a8._8_4_;
              local_478._0_8_ = local_7a8._8_8_;
              local_478._12_4_ = local_7a8._12_4_;
              local_888._8_4_ = SUB84(dVar18,0);
              local_888._0_8_ = dVar44;
              local_888._12_4_ = uVar37;
              dVar47 = (double)local_6c8._0_8_ + dVar44 + local_798._8_8_ + local_7a8._8_8_ + dVar18
              ;
              local_4c8._8_4_ = SUB84(dVar47,0);
              local_4c8._0_8_ = (dVar46 - local_7a8._0_8_) + dVar44;
              local_4c8._12_4_ = (int)((ulong)dVar47 >> 0x20);
              local_7c8._8_4_ = SUB84(dVar18,0);
              local_7c8._0_8_ = dVar18;
              local_7c8._12_4_ = uVar37;
              dVar46 = exp((double)local_458._0_8_);
              local_6b8._8_4_ = extraout_XMM0_Dc_15;
              local_6b8._0_8_ = dVar46;
              local_6b8._12_4_ = extraout_XMM0_Dd_15;
              dVar46 = exp((double)local_618._0_8_);
              local_4d8._8_4_ = extraout_XMM0_Dc_16;
              local_4d8._0_8_ = dVar46;
              local_4d8._12_4_ = extraout_XMM0_Dd_16;
              dVar46 = exp((double)local_3b8._0_8_);
              local_618._0_8_ = dVar46;
              dVar46 = exp((double)local_778._0_8_);
              local_458._0_8_ = dVar46;
              dVar46 = exp((double)local_448._0_8_);
              dVar47 = (double)local_6b8._0_8_ * 130000.0;
              local_448._8_4_ = SUB84(dVar47,0);
              local_448._0_8_ = dVar46 * 48200000.0;
              local_448._12_4_ = (int)((ulong)dVar47 >> 0x20);
              dStack_8e0 = auVar5._8_8_;
              local_778._8_4_ = SUB84(dStack_8e0 * dVar47,0);
              local_778._0_8_ = dVar48 * dVar8 * dVar46 * 48200000.0;
              local_778._12_4_ = (int)((ulong)(dStack_8e0 * dVar47) >> 0x20);
              dVar46 = exp(local_338);
              dVar17 = (double)local_778._0_8_ -
                       (double)local_878._0_8_ * (double)local_748._0_8_ *
                       dVar46 * (double)local_448._0_8_;
              dVar50 = (double)local_778._8_8_ -
                       (double)local_758._8_8_ * (double)local_4d8._0_8_ * (double)local_448._8_8_;
              uVar37 = (undefined4)((ulong)dVar50 >> 0x20);
              dVar47 = dVar48 * dVar8 * (double)local_618._0_8_ * 24100000.0 -
                       (double)local_5e8._0_8_ * dVar57 *
                       (double)local_618._0_8_ * 24100000.0 * (double)local_458._0_8_;
              local_858._8_4_ = SUB84((double)local_4c8._8_8_ + dVar50,0);
              local_858._0_8_ = (double)local_4c8._0_8_ + dVar17;
              local_858._12_4_ = (int)((ulong)((double)local_4c8._8_8_ + dVar50) >> 0x20);
              local_778._8_4_ = SUB84(dVar50,0);
              local_778._0_8_ = dVar17;
              local_778._12_4_ = uVar37;
              local_878._8_4_ = SUB84(dVar50,0);
              local_878._0_8_ = dVar50;
              local_878._12_4_ = uVar37;
              dVar46 = exp(local_438 + local_438 + (double)local_3b8._0_8_);
              local_758._0_8_ = dVar46 * 9.55;
              uVar37 = local_808._12_4_;
              local_808._8_4_ = local_808._8_4_;
              local_808._0_8_ = local_808._0_8_ * dVar8 * dVar46 * 9.55;
              local_808._12_4_ = uVar37;
              dVar46 = exp(-((((double)local_608._0_8_ - (double)local_7e8._0_8_) -
                             (double)local_6a8._0_8_) + (double)local_428._0_8_));
              dVar19 = (double)local_808._0_8_ -
                       (double)local_7f8._8_8_ * dVar46 * (double)local_758._0_8_;
              dVar46 = dVar56 * (double)local_4e8._0_8_ * 70790000.0 -
                       (double)local_468._0_8_ *
                       (double)local_4a8._0_8_ * (double)local_4e8._0_8_ * 70790000.0;
              dVar56 = (double)local_4b8._0_8_ * (double)local_498._0_8_ * 2.97 -
                       (double)local_468._0_8_ *
                       (double)local_488._0_8_ * (double)local_498._0_8_ * 2.97;
              dVar48 = ((dVar7 + dVar53 + dVar54) - dVar56) + (double)local_478._0_8_;
              dVar45 = (dVar46 + dVar46 +
                        dVar56 + dVar56 +
                        ((((dVar45 + dVar45 + 0.0 + dVar49) - dVar53) + dVar16 + dVar58) - dVar54) +
                       (double)local_7b8._0_8_) - (double)local_478._0_8_;
              dVar49 = (((((((dVar51 + 0.0) - dVar44) - dVar46) - (double)local_7b8._0_8_) -
                         (double)local_478._0_8_) -
                        ((double)local_7c8._0_8_ + (double)local_7c8._0_8_)) -
                       ((double)local_878._0_8_ + (double)local_878._0_8_)) +
                       (double)local_778._0_8_;
              dVar56 = (((((double)local_788._0_8_ + (double)local_518._0_8_) -
                         (double)local_798._0_8_) - dVar56) - (double)local_798._8_8_) - dVar19;
              auStack_840._8_4_ = SUB84(dVar56,0);
              auStack_840._0_8_ =
                   (((((double)local_7a8._0_8_ + (double)local_768._0_8_) - (double)local_888._0_8_)
                    - dVar46) - dVar47) - (double)local_778._0_8_;
              auStack_840._12_4_ = (int)((ulong)dVar56 >> 0x20);
              dVar46 = -((((double)local_7e8._0_8_ - (double)local_5f8._0_8_) -
                         (double)local_6a8._0_8_) + (double)local_428._0_8_);
              uVar20 = local_7e8._12_4_;
              local_7e8._8_4_ = local_7e8._8_4_;
              local_7e8._0_8_ = dVar46;
              local_7e8._12_4_ = uVar20 ^ 0x80000000;
              dVar46 = exp(dVar46);
              uVar37 = local_748._12_4_;
              dVar56 = local_748._0_8_ * (double)local_5e8._0_8_;
              local_748._8_4_ = local_748._8_4_;
              local_748._0_8_ = dVar56;
              local_748._12_4_ = uVar37;
              dVar58 = dVar8 * dVar57 * 1000000.0 - dVar46 * 1000000.0 * dVar56;
              dVar46 = exp(local_418 * -4809.24167509571);
              dVar56 = exp((double)local_7e8._0_8_);
              dVar57 = dVar8 * dVar57 * dVar46 * 580000000.0 -
                       dVar56 * dVar46 * 580000000.0 * (double)local_748._0_8_;
              local_848 = dVar48 + dVar47 + dVar58 + dVar57;
              dStack_830 = ((dVar45 + dVar47 + dVar19) - dVar58) - dVar57;
              local_828 = dVar49 + dVar19 + dVar58 + dVar57;
              dStack_820 = (((((dVar6 + dVar18 + dVar50) - dVar47) - dVar17) - dVar19) - dVar58) -
                           dVar57;
              lVar35 = 0;
              do {
                *(double *)(local_660 + lVar35 * 8 + -8) =
                     *(double *)(local_660 + lVar35 * 8 + -8) * 1e-06;
                *(double *)(local_858 + lVar35 * 8) = *(double *)(local_858 + lVar35 * 8) * 1e-06;
                lVar35 = lVar35 + 1;
              } while (lVar35 != 9);
              local_8d8._8_8_ = 0x403fff7ced916873;
              local_8d8._0_8_ = 0x400020c49ba5e354;
              local_8c8 = 18.015;
              dStack_8c0 = 1.008;
              uStack_8b0 = 17.007;
              local_8b8 = (undefined1  [8])0x402fff7ced916873;
              local_8a8 = 33.006;
              dStack_8a0 = 34.014;
              local_898 = (undefined1 *)0x403c0395810624dd;
              lVar35 = 0;
              do {
                *(double *)(local_858 + lVar35 * 8) =
                     *(double *)(local_8d8 + lVar35 * 8) * *(double *)(local_858 + lVar35 * 8);
                lVar35 = lVar35 + 1;
              } while (lVar35 != 9);
              lVar35 = 0;
              dVar57 = local_678;
              do {
                dVar46 = *(double *)(local_858 + lVar35 * 8);
                dVar56 = local_c8[lVar35 + 10];
                local_168[lVar35] = dVar46 + dVar56;
                dVar57 = dVar57 - (dVar46 + dVar56) * *(double *)(local_5d8 + lVar35 * 8);
                lVar35 = lVar35 + 1;
              } while (lVar35 != 9);
              local_168[9] = (local_3c0 / local_860) * dVar57;
              dVar57 = local_200[lVar24];
              dVar46 = *(double *)(local_234 + lVar24 * 8 + 4);
              dVar56 = local_200[lVar24 + 6];
              lVar35 = 0;
              do {
                dVar58 = local_168[lVar35];
                dVar48 = local_168[lVar35 + 1];
                dVar6 = dVar56 * local_7d0 * dVar48 + local_118[lVar35 + 1];
                auVar14._8_4_ = SUB84(dVar6,0);
                auVar14._0_8_ = dVar56 * local_7d0 * dVar58 + local_118[lVar35];
                auVar14._12_4_ = (int)((ulong)dVar6 >> 0x20);
                *(undefined1 (*) [16])(local_118 + lVar35) = auVar14;
                dVar47 = dVar46 * local_7d0 * dVar58 + local_c8[lVar35];
                dVar6 = dVar46 * local_7d0 * dVar48 + local_c8[lVar35 + 1];
                auVar15._8_4_ = SUB84(dVar6,0);
                auVar15._0_8_ = dVar47;
                auVar15._12_4_ = (int)((ulong)dVar6 >> 0x20);
                *(undefined1 (*) [16])(local_2d8 + lVar35 * 8) = auVar15;
                dVar6 = dVar48 * dVar57 * local_7d0 + dVar6;
                auVar11._8_4_ = SUB84(dVar6,0);
                auVar11._0_8_ = dVar58 * dVar57 * local_7d0 + dVar47;
                auVar11._12_4_ = (int)((ulong)dVar6 >> 0x20);
                *(undefined1 (*) [16])(local_c8 + lVar35) = auVar11;
                lVar35 = lVar35 + 2;
              } while (lVar35 != 10);
              lVar24 = lVar24 + 1;
              uVar26 = (ulong)(int)local_238;
              uVar37 = SUB84(local_670,0);
              uVar38 = (undefined4)((ulong)local_670 >> 0x20);
              lVar35 = local_3d8;
            } while (lVar24 < (long)uVar26);
          }
          dVar46 = local_200[0xe];
          lVar24 = 0;
          dVar57 = 1e-50;
          do {
            dVar56 = ABS(*(double *)((long)local_118 + lVar24));
            if (ABS(*(double *)((long)local_118 + lVar24)) <= dVar57) {
              dVar56 = dVar57;
            }
            lVar24 = lVar24 + 8;
            dVar57 = dVar56;
          } while (lVar24 != 0x50);
          if (local_178 <= dVar56) {
            dVar57 = pow(local_178 / dVar56,local_200[0xd]);
            uVar37 = SUB84(local_7d0,0);
            uVar38 = (undefined4)((ulong)local_7d0 >> 0x20);
            local_7d0 = dVar46 * dVar57 * local_7d0;
            if (local_7d0 <= local_3e0) {
              local_7d0 = local_3e0;
            }
          }
          else {
            dVar57 = pow(local_178 / dVar56,local_200[0xc]);
            uVar37 = SUB84(local_7d0,0);
            uVar38 = (undefined4)((ulong)local_7d0 >> 0x20);
            local_7d0 = dVar46 * dVar57 * local_7d0;
            if (local_3e8 <= local_7d0) {
              local_7d0 = local_3e8;
            }
          }
          local_6f8 = local_6f8 + (double)CONCAT44(uVar38,uVar37);
          iVar23 = local_6ec + 1;
          uVar37 = SUB84(local_670,0);
          uVar38 = (undefined4)((ulong)local_670 >> 0x20);
          pdVar25 = local_258;
          pdVar31 = local_278;
          uVar32 = local_3f8;
          uVar33 = local_3f0;
          dVar46 = local_678;
        } while (local_6f8 < local_240);
      }
      local_170[uVar33] = iVar23;
      paVar28 = local_2d8;
      puVar30 = (undefined8 *)(lVar35 + (long)pdVar31);
      for (lVar24 = 10; lVar24 != 0; lVar24 = lVar24 + -1) {
        *puVar30 = *(undefined8 *)paVar28;
        paVar28 = paVar28 + ((ulong)bVar36 * -2 + 1) * 8;
        puVar30 = puVar30 + (ulong)bVar36 * -2 + 1;
      }
      pdVar25[uVar33] = dVar46 * local_270 + (double)CONCAT44(uVar38,uVar37);
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar32);
    uVar33 = 0;
    iVar23 = 0;
    do {
      iVar23 = iVar23 + local_408[uVar33];
      uVar33 = uVar33 + 1;
    } while (uVar32 != uVar33);
    local_950 = (double)iVar23;
    a_size = local_400;
  }
  sVar34 = local_688;
  pdVar31 = local_690;
  pdVar25 = local_708;
  __dest = local_718;
  pRVar21 = local_720;
  if ((int)a_size != 0) {
    memcpy(local_728,local_710,local_730 << 3);
    memcpy(pRVar21,pdVar25,sVar34 << 3);
    memcpy(__dest,local_700,a_size << 3);
    memcpy(local_680,pdVar31,a_size << 3);
  }
  if (local_320.m_data != (pointer)0x0) {
    operator_delete(local_320.m_data,local_320.m_capacity << 2);
  }
  if (local_308.m_data != (pointer)0x0) {
    operator_delete(local_308.m_data,local_308.m_capacity << 3);
  }
  if (local_2f0.m_data != (pointer)0x0) {
    operator_delete(local_2f0.m_data,local_2f0.m_capacity << 3);
  }
  if (local_3a0.m_data != (pointer)0x0) {
    operator_delete(local_3a0.m_data,local_3a0.m_capacity << 3);
  }
  if (local_388.m_data != (pointer)0x0) {
    operator_delete(local_388.m_data,local_388.m_capacity << 3);
  }
  return (int)(local_950 / (double)(int)a_size);
}

Assistant:

int
ReactorRK64::react(
  amrex::Real* rY_in,
  amrex::Real* rYsrc_in,
  amrex::Real* rX_in,
  amrex::Real* rX_src_in,
  amrex::Real& dt_react,
  amrex::Real& time,
  int ncells
#ifdef AMREX_USE_GPU
  ,
  amrex::gpuStream_t /*stream*/
#endif
)
{
  BL_PROFILE("Pele::ReactorRK64::react()");

  amrex::Real time_init = time;
  amrex::Real time_out = time + dt_react;
  const amrex::Real tinyval = 1e-50;

  // Copy to device
  amrex::Gpu::DeviceVector<amrex::Real> rY(ncells * (NUM_SPECIES + 1), 0);
  amrex::Gpu::DeviceVector<amrex::Real> rYsrc(ncells * NUM_SPECIES, 0);
  amrex::Gpu::DeviceVector<amrex::Real> rX(ncells, 0);
  amrex::Gpu::DeviceVector<amrex::Real> rX_src(ncells, 0);
  amrex::Real* d_rY = rY.data();
  amrex::Real* d_rYsrc = rYsrc.data();
  amrex::Real* d_rX = rX.data();
  amrex::Real* d_rX_src = rX_src.data();
  amrex::Gpu::copy(
    amrex::Gpu::hostToDevice, rY_in, rY_in + ncells * (NUM_SPECIES + 1), d_rY);
  amrex::Gpu::copy(
    amrex::Gpu::hostToDevice, rYsrc_in, rYsrc_in + ncells * NUM_SPECIES,
    d_rYsrc);
  amrex::Gpu::copy(amrex::Gpu::hostToDevice, rX_in, rX_in + ncells, d_rX);
  amrex::Gpu::copy(
    amrex::Gpu::hostToDevice, rX_src_in, rX_src_in + ncells, d_rX_src);

  // capture reactor type
  const int captured_reactor_type = m_reactor_type;
  const int captured_nsubsteps_guess = rk64_nsubsteps_guess;
  const int captured_nsubsteps_min = rk64_nsubsteps_min;
  const int captured_nsubsteps_max = rk64_nsubsteps_max;
  const amrex::Real captured_abstol = absTol;
  RK64Params rkp;

  amrex::Gpu::DeviceVector<int> v_nsteps(ncells, 0);
  int* d_nsteps = v_nsteps.data();

  amrex::ParallelFor(ncells, [=] AMREX_GPU_DEVICE(int icell) noexcept {
    amrex::Real soln_reg[NUM_SPECIES + 1] = {0.0};
    amrex::Real carryover_reg[NUM_SPECIES + 1] = {0.0};
    amrex::Real error_reg[NUM_SPECIES + 1] = {0.0};
    amrex::Real rhs[NUM_SPECIES + 1] = {0.0};
    amrex::Real rYsrc_ext[NUM_SPECIES] = {0.0};
    amrex::Real current_time = time_init;
    const int neq = (NUM_SPECIES + 1);

    for (int sp = 0; sp < neq; sp++) {
      soln_reg[sp] = d_rY[icell * neq + sp];
      carryover_reg[sp] = soln_reg[sp];
    }

    amrex::Real dt_rk = dt_react / amrex::Real(captured_nsubsteps_guess);
    amrex::Real dt_rk_min = dt_react / amrex::Real(captured_nsubsteps_max);
    amrex::Real dt_rk_max = dt_react / amrex::Real(captured_nsubsteps_min);

    amrex::Real rhoe_init[] = {d_rX[icell]};
    amrex::Real rhoesrc_ext[] = {d_rX_src[icell]};

    for (int sp = 0; sp < NUM_SPECIES; sp++) {
      rYsrc_ext[sp] = d_rYsrc[icell * NUM_SPECIES + sp];
    }

    int nsteps = 0;
    amrex::Real change_factor;
    while (current_time < time_out) {
      for (amrex::Real& sp : error_reg) {
        sp = 0.0;
      }
      for (int stage = 0; stage < rkp.nstages_rk64; stage++) {
        utils::fKernelSpec<Ordering>(
          0, 1, current_time - time_init, captured_reactor_type, soln_reg, rhs,
          rhoe_init, rhoesrc_ext, rYsrc_ext);

        for (int sp = 0; sp < neq; sp++) {
          error_reg[sp] += rkp.err_rk64[stage] * dt_rk * rhs[sp];
          soln_reg[sp] =
            carryover_reg[sp] + rkp.alpha_rk64[stage] * dt_rk * rhs[sp];
          carryover_reg[sp] =
            soln_reg[sp] + rkp.beta_rk64[stage] * dt_rk * rhs[sp];
        }
      }

      current_time += dt_rk;
      nsteps++;

      amrex::Real max_err = tinyval;
      for (amrex::Real sp : error_reg) {
        max_err = fabs(sp) > max_err ? fabs(sp) : max_err;
      }

      if (max_err < captured_abstol) {
        change_factor =
          rkp.betaerr_rk64 * pow((captured_abstol / max_err), rkp.exp1_rk64);
        dt_rk = amrex::min<amrex::Real>(dt_rk_max, dt_rk * change_factor);
      } else {
        change_factor =
          rkp.betaerr_rk64 * pow((captured_abstol / max_err), rkp.exp2_rk64);
        dt_rk = amrex::max<amrex::Real>(dt_rk_min, dt_rk * change_factor);
      }
    }
    // Don't overstep the integration time
    dt_rk = amrex::min<amrex::Real>(dt_rk, time_out - current_time);
    d_nsteps[icell] = nsteps;
    // copy data back
    for (int sp = 0; sp < neq; sp++) {
      d_rY[icell * neq + sp] = soln_reg[sp];
    }
    d_rX[icell] = rhoe_init[0] + dt_react * rhoesrc_ext[0];
  });

#ifdef MOD_REACTOR
  time = time_out;
#endif

  const int avgsteps = amrex::Reduce::Sum<int>(
    ncells, [=] AMREX_GPU_DEVICE(int i) noexcept -> int { return d_nsteps[i]; },
    0);

  amrex::Gpu::copy(
    amrex::Gpu::deviceToHost, d_rY, d_rY + ncells * (NUM_SPECIES + 1), rY_in);
  amrex::Gpu::copy(
    amrex::Gpu::deviceToHost, d_rYsrc, d_rYsrc + ncells * NUM_SPECIES,
    rYsrc_in);
  amrex::Gpu::copy(amrex::Gpu::deviceToHost, d_rX, d_rX + ncells, rX_in);
  amrex::Gpu::copy(
    amrex::Gpu::deviceToHost, d_rX_src, d_rX_src + ncells, rX_src_in);

  return (int(avgsteps / amrex::Real(ncells)));
}